

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  long lVar25;
  RTCFilterFunctionN p_Var26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined3 uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined6 uVar78;
  undefined1 auVar79 [12];
  unkbyte9 Var80;
  undefined1 auVar81 [13];
  undefined1 auVar82 [12];
  undefined1 auVar83 [13];
  undefined1 auVar84 [12];
  undefined1 auVar85 [13];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [13];
  undefined1 auVar91 [12];
  undefined1 auVar92 [13];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [13];
  undefined1 auVar124 [13];
  undefined1 auVar125 [13];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  byte bVar129;
  ulong uVar130;
  ulong uVar131;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar132;
  long lVar133;
  long lVar134;
  ulong uVar135;
  bool bVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  char cVar141;
  short sVar142;
  char cVar184;
  undefined1 uVar187;
  undefined2 uVar186;
  int iVar143;
  undefined1 auVar145 [12];
  undefined1 uVar185;
  int iVar188;
  vfloat_impl<4> p00;
  char cVar191;
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar146 [12];
  undefined1 auVar154 [16];
  float fVar192;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined8 extraout_XMM1_Qa;
  float fVar210;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar208 [16];
  char cVar212;
  char cVar240;
  float t1;
  undefined1 auVar214 [12];
  float fVar241;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar213;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar244;
  undefined8 uVar245;
  char cVar252;
  float fVar254;
  float fVar256;
  undefined1 auVar246 [16];
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar258;
  undefined1 auVar262 [12];
  float fVar305;
  vfloat4 a;
  float fVar259;
  float fVar260;
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  float fVar307;
  undefined1 auVar276 [16];
  undefined1 auVar264 [12];
  undefined1 auVar280 [16];
  undefined1 auVar265 [12];
  undefined1 auVar284 [16];
  float fVar310;
  float fVar311;
  float fVar314;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar266 [12];
  undefined1 auVar289 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar312;
  float fVar313;
  float fVar315;
  float fVar316;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar317;
  undefined1 auVar318 [12];
  float fVar339;
  float fVar340;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar319 [12];
  undefined1 auVar325 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar348;
  undefined1 auVar341 [12];
  undefined1 auVar342 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar349;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar369;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  float fVar370;
  float fVar381;
  float fVar384;
  undefined1 auVar373 [16];
  float fVar371;
  float fVar372;
  float fVar382;
  float fVar383;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar397;
  float fVar401;
  vfloat4 a_1;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  float fVar407;
  float fVar413;
  float fVar415;
  vfloat4 a_3;
  undefined1 auVar408 [16];
  float fVar414;
  float fVar416;
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  float fVar417;
  float fVar418;
  float fVar423;
  float fVar425;
  undefined1 auVar419 [16];
  float fVar424;
  float fVar426;
  float fVar427;
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  float fVar428;
  float fVar429;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  float fVar438;
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  float fVar442;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_428;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [6];
  undefined2 uStack_402;
  float fStack_400;
  float fStack_3fc;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3dc;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [6];
  undefined2 uStack_362;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  float fStack_348;
  float fStack_344;
  ulong local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar144 [12];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar148 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  int iVar189;
  int iVar190;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar261 [12];
  undefined1 auVar263 [12];
  undefined1 auVar290 [16];
  undefined1 auVar269 [16];
  undefined1 auVar273 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  undefined1 auVar285 [16];
  undefined1 auVar291 [16];
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar286 [16];
  undefined1 auVar292 [16];
  int iVar306;
  int iVar308;
  int iVar309;
  undefined1 auVar322 [16];
  undefined1 auVar326 [16];
  undefined1 auVar323 [16];
  undefined1 auVar327 [16];
  undefined1 auVar324 [16];
  undefined1 auVar328 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  
  PVar13 = prim[1];
  uVar130 = (ulong)(byte)PVar13;
  lVar133 = uVar130 * 0x25;
  uVar5 = *(undefined4 *)(prim + uVar130 * 4 + 6);
  uVar14 = *(undefined4 *)(prim + uVar130 * 5 + 6);
  uVar15 = *(undefined4 *)(prim + uVar130 * 6 + 6);
  uVar6 = *(undefined4 *)(prim + uVar130 * 0xf + 6);
  uVar16 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar17 = *(undefined4 *)(prim + uVar130 * 0x11 + 6);
  uVar18 = *(undefined4 *)(prim + uVar130 * 0x1a + 6);
  uVar19 = *(undefined4 *)(prim + uVar130 * 0x1b + 6);
  uVar20 = *(undefined4 *)(prim + uVar130 * 0x1c + 6);
  pPVar4 = prim + lVar133 + 6;
  fVar435 = *(float *)(pPVar4 + 0xc);
  fVar317 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar4) * fVar435;
  fVar339 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar435;
  fVar340 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar435;
  fVar428 = fVar435 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar433 = fVar435 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar435 = fVar435 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar187 = (undefined1)((uint)uVar18 >> 0x18);
  uVar186 = CONCAT11((char)((uint)uVar14 >> 0x18),uVar187);
  uVar185 = (undefined1)((uint)uVar18 >> 0x10);
  uVar245 = CONCAT35(CONCAT21(uVar186,(char)((uint)uVar14 >> 0x10)),CONCAT14(uVar185,uVar18));
  cVar240 = (char)((uint)uVar14 >> 8);
  cVar184 = (char)((uint)uVar18 >> 8);
  uVar78 = CONCAT51(CONCAT41((int)((ulong)uVar245 >> 0x20),cVar240),cVar184);
  cVar141 = (char)uVar18;
  cVar212 = (char)uVar14;
  uVar131 = CONCAT62(uVar78,CONCAT11(cVar212,cVar141));
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar131;
  auVar230._12_2_ = uVar186;
  auVar230._14_2_ = uVar186;
  uVar186 = (undefined2)((ulong)uVar245 >> 0x20);
  auVar158._12_4_ = auVar230._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar131;
  auVar158._10_2_ = uVar186;
  auVar294._10_6_ = auVar158._10_6_;
  auVar294._8_2_ = uVar186;
  auVar294._0_8_ = uVar131;
  uVar186 = (undefined2)uVar78;
  auVar79._4_8_ = auVar294._8_8_;
  auVar79._2_2_ = uVar186;
  auVar79._0_2_ = uVar186;
  iVar143 = (int)CONCAT11(cVar212,cVar141) >> 8;
  iVar188 = auVar79._0_4_ >> 0x18;
  auVar144._0_8_ = CONCAT44(iVar188,iVar143);
  auVar144._8_4_ = auVar294._8_4_ >> 0x18;
  auVar232._12_4_ = auVar158._12_4_ >> 0x18;
  auVar232._0_12_ = auVar144;
  fVar369 = (float)iVar188;
  cVar191 = cVar240 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar232._0_13_;
  auVar38[0xe] = cVar191;
  auVar43[0xc] = cVar191;
  auVar43._0_12_ = auVar144;
  auVar43._13_2_ = auVar38._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar144._0_11_;
  auVar48._12_3_ = auVar43._12_3_;
  auVar53[10] = cVar191;
  auVar53._0_10_ = auVar144._0_10_;
  auVar53._11_4_ = auVar48._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar144._0_9_;
  auVar58._10_5_ = auVar53._10_5_;
  auVar63[8] = cVar240;
  auVar63._0_8_ = auVar144._0_8_;
  auVar63._9_6_ = auVar58._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar15 >> 0x18)),(short)cVar212 >> 7);
  auVar68._6_9_ = Var80;
  auVar68[5] = (char)((uint)uVar15 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar212 >> 7);
  auVar68._0_4_ = iVar143;
  cVar252 = (char)((uint)uVar15 >> 8);
  auVar81._2_11_ = auVar68._4_11_;
  auVar81[1] = cVar252;
  auVar81[0] = (undefined1)((short)cVar212 >> 7);
  cVar240 = (char)uVar15;
  auVar73._2_13_ = auVar81;
  auVar73._0_2_ = CONCAT11(cVar240,cVar212);
  uVar186 = (undefined2)Var80;
  auVar375._0_12_ = auVar73._0_12_;
  auVar375._12_2_ = uVar186;
  auVar375._14_2_ = uVar186;
  auVar148._12_4_ = auVar375._12_4_;
  auVar148._0_10_ = auVar73._0_10_;
  auVar148._10_2_ = auVar68._4_2_;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._0_8_ = auVar73._0_8_;
  auVar147._8_2_ = auVar68._4_2_;
  auVar82._4_8_ = auVar147._8_8_;
  auVar82._2_2_ = auVar81._0_2_;
  auVar82._0_2_ = auVar81._0_2_;
  iVar188 = (int)CONCAT11(cVar240,cVar212) >> 8;
  iVar189 = auVar82._0_4_ >> 0x18;
  auVar145._0_8_ = CONCAT44(iVar189,iVar188);
  auVar145._8_4_ = auVar147._8_4_ >> 0x18;
  auVar149._12_4_ = auVar148._12_4_ >> 0x18;
  auVar149._0_12_ = auVar145;
  fVar397 = (float)iVar189;
  cVar191 = cVar252 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar149._0_13_;
  auVar39[0xe] = cVar191;
  auVar44[0xc] = cVar191;
  auVar44._0_12_ = auVar145;
  auVar44._13_2_ = auVar39._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar145._0_11_;
  auVar49._12_3_ = auVar44._12_3_;
  auVar54[10] = cVar191;
  auVar54._0_10_ = auVar145._0_10_;
  auVar54._11_4_ = auVar49._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar145._0_9_;
  auVar59._10_5_ = auVar54._10_5_;
  auVar64[8] = cVar252;
  auVar64._0_8_ = auVar145._0_8_;
  auVar64._9_6_ = auVar59._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar64._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar240 >> 7);
  auVar69._6_9_ = Var80;
  auVar69[5] = (char)((uint)uVar16 >> 0x10);
  auVar69[4] = (undefined1)((short)cVar240 >> 7);
  auVar69._0_4_ = iVar188;
  cVar252 = (char)((uint)uVar16 >> 8);
  auVar83._2_11_ = auVar69._4_11_;
  auVar83[1] = cVar252;
  auVar83[0] = (undefined1)((short)cVar240 >> 7);
  cVar212 = (char)uVar16;
  auVar74._2_13_ = auVar83;
  auVar74._0_2_ = CONCAT11(cVar212,cVar240);
  uVar186 = (undefined2)Var80;
  auVar152._0_12_ = auVar74._0_12_;
  auVar152._12_2_ = uVar186;
  auVar152._14_2_ = uVar186;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar74._0_10_;
  auVar151._10_2_ = auVar69._4_2_;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._0_8_ = auVar74._0_8_;
  auVar150._8_2_ = auVar69._4_2_;
  auVar84._4_8_ = auVar150._8_8_;
  auVar84._2_2_ = auVar83._0_2_;
  auVar84._0_2_ = auVar83._0_2_;
  iVar189 = (int)CONCAT11(cVar212,cVar240) >> 8;
  iVar190 = auVar84._0_4_ >> 0x18;
  auVar146._0_8_ = CONCAT44(iVar190,iVar189);
  auVar146._8_4_ = auVar150._8_4_ >> 0x18;
  auVar153._12_4_ = auVar151._12_4_ >> 0x18;
  auVar153._0_12_ = auVar146;
  fVar357 = (float)iVar190;
  cVar191 = cVar252 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar153._0_13_;
  auVar40[0xe] = cVar191;
  auVar45[0xc] = cVar191;
  auVar45._0_12_ = auVar146;
  auVar45._13_2_ = auVar40._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar146._0_11_;
  auVar50._12_3_ = auVar45._12_3_;
  auVar55[10] = cVar191;
  auVar55._0_10_ = auVar146._0_10_;
  auVar55._11_4_ = auVar50._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar146._0_9_;
  auVar60._10_5_ = auVar55._10_5_;
  auVar65[8] = cVar252;
  auVar65._0_8_ = auVar146._0_8_;
  auVar65._9_6_ = auVar60._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar65._8_7_,(char)((uint)uVar17 >> 0x18)),(short)cVar212 >> 7);
  auVar70._6_9_ = Var80;
  auVar70[5] = (char)((uint)uVar17 >> 0x10);
  auVar70[4] = (undefined1)((short)cVar212 >> 7);
  auVar70._0_4_ = iVar189;
  auVar85._2_11_ = auVar70._4_11_;
  auVar85[1] = (char)((uint)uVar17 >> 8);
  auVar85[0] = (undefined1)((short)cVar212 >> 7);
  sVar142 = CONCAT11((char)uVar17,cVar212);
  auVar75._2_13_ = auVar85;
  auVar75._0_2_ = sVar142;
  uVar186 = (undefined2)Var80;
  auVar156._0_12_ = auVar75._0_12_;
  auVar156._12_2_ = uVar186;
  auVar156._14_2_ = uVar186;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar75._0_10_;
  auVar155._10_2_ = auVar70._4_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar75._0_8_;
  auVar154._8_2_ = auVar70._4_2_;
  auVar86._4_8_ = auVar154._8_8_;
  auVar86._2_2_ = auVar85._0_2_;
  auVar86._0_2_ = auVar85._0_2_;
  fVar370 = (float)((int)sVar142 >> 8);
  fVar381 = (float)(auVar86._0_4_ >> 0x18);
  fVar384 = (float)(auVar154._8_4_ >> 0x18);
  fVar258 = fVar435 * fVar370;
  fVar305 = fVar435 * fVar381;
  auVar261._0_8_ = CONCAT44(fVar305,fVar258);
  auVar261._8_4_ = fVar435 * fVar384;
  auVar267._12_4_ = fVar435 * (float)(auVar155._12_4_ >> 0x18);
  auVar267._0_12_ = auVar261;
  fVar438 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar133 + 0x16)) *
            *(float *)(prim + lVar133 + 0x1a);
  local_418[0] = (char)uVar5;
  local_418[1] = (char)((uint)uVar5 >> 8);
  local_418[2] = (undefined1)((uint)uVar5 >> 0x10);
  local_418[3] = (undefined1)((uint)uVar5 >> 0x18);
  auVar100[0xd] = 0;
  auVar100._0_13_ = auVar267._0_13_;
  auVar100[0xe] = (char)((uint)fVar305 >> 0x18);
  auVar105[0xc] = (char)((uint)fVar305 >> 0x10);
  auVar105._0_12_ = auVar261;
  auVar105._13_2_ = auVar100._13_2_;
  auVar108[0xb] = 0;
  auVar108._0_11_ = auVar261._0_11_;
  auVar108._12_3_ = auVar105._12_3_;
  auVar111[10] = (char)((uint)fVar305 >> 8);
  auVar111._0_10_ = auVar261._0_10_;
  auVar111._11_4_ = auVar108._11_4_;
  auVar114[9] = 0;
  auVar114._0_9_ = auVar261._0_9_;
  auVar114._10_5_ = auVar111._10_5_;
  auVar117[8] = SUB41(fVar305,0);
  auVar117._0_8_ = auVar261._0_8_;
  auVar117._9_6_ = auVar114._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar117._8_7_,local_418[3]),(char)((uint)fVar258 >> 0x18));
  auVar120._6_9_ = Var80;
  auVar120[5] = local_418[2];
  auVar120[4] = (char)((uint)fVar258 >> 0x10);
  auVar120._0_4_ = fVar258;
  auVar123._2_11_ = auVar120._4_11_;
  auVar123[1] = local_418[1];
  auVar123[0] = (char)((uint)fVar258 >> 8);
  sVar142 = CONCAT11(local_418[0],SUB41(fVar258,0));
  auVar126._2_13_ = auVar123;
  auVar126._0_2_ = sVar142;
  uVar186 = (undefined2)Var80;
  auVar270._0_12_ = auVar126._0_12_;
  auVar270._12_2_ = uVar186;
  auVar270._14_2_ = uVar186;
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._0_10_ = auVar126._0_10_;
  auVar269._10_2_ = auVar120._4_2_;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._0_8_ = auVar126._0_8_;
  auVar268._8_2_ = auVar120._4_2_;
  auVar87._4_8_ = auVar268._8_8_;
  auVar87._2_2_ = auVar123._0_2_;
  auVar87._0_2_ = auVar123._0_2_;
  iVar190 = (int)sVar142 >> 8;
  iVar306 = auVar87._0_4_ >> 0x18;
  auVar262._0_8_ = CONCAT44(iVar306,iVar190);
  auVar262._8_4_ = auVar268._8_4_ >> 0x18;
  auVar271._12_4_ = auVar269._12_4_ >> 0x18;
  auVar271._0_12_ = auVar262;
  fVar348 = (float)iVar306;
  local_428._0_1_ = (undefined1)uVar6;
  local_428._1_1_ = (undefined1)((uint)uVar6 >> 8);
  local_428._2_1_ = (undefined1)((uint)uVar6 >> 0x10);
  local_428._3_1_ = (undefined1)((uint)uVar6 >> 0x18);
  cVar191 = local_418[1] >> 7;
  auVar101[0xd] = 0;
  auVar101._0_13_ = auVar271._0_13_;
  auVar101[0xe] = cVar191;
  auVar106[0xc] = cVar191;
  auVar106._0_12_ = auVar262;
  auVar106._13_2_ = auVar101._13_2_;
  auVar109[0xb] = 0;
  auVar109._0_11_ = auVar262._0_11_;
  auVar109._12_3_ = auVar106._12_3_;
  auVar112[10] = cVar191;
  auVar112._0_10_ = auVar262._0_10_;
  auVar112._11_4_ = auVar109._11_4_;
  auVar115[9] = 0;
  auVar115._0_9_ = auVar262._0_9_;
  auVar115._10_5_ = auVar112._10_5_;
  auVar118[8] = local_418[1];
  auVar118._0_8_ = auVar262._0_8_;
  auVar118._9_6_ = auVar115._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar118._8_7_,local_428._3_1_),(short)local_418[0] >> 7);
  auVar121._6_9_ = Var80;
  auVar121[5] = local_428._2_1_;
  auVar121[4] = (undefined1)((short)local_418[0] >> 7);
  auVar121._0_4_ = iVar190;
  auVar124._2_11_ = auVar121._4_11_;
  auVar124[1] = local_428._1_1_;
  auVar124[0] = (undefined1)((short)local_418[0] >> 7);
  auVar127._2_13_ = auVar124;
  auVar127._0_2_ = CONCAT11((undefined1)local_428,local_418[0]);
  uVar186 = (undefined2)Var80;
  auVar274._0_12_ = auVar127._0_12_;
  auVar274._12_2_ = uVar186;
  auVar274._14_2_ = uVar186;
  auVar273._12_4_ = auVar274._12_4_;
  auVar273._0_10_ = auVar127._0_10_;
  auVar273._10_2_ = auVar121._4_2_;
  auVar272._10_6_ = auVar273._10_6_;
  auVar272._0_8_ = auVar127._0_8_;
  auVar272._8_2_ = auVar121._4_2_;
  auVar88._4_8_ = auVar272._8_8_;
  auVar88._2_2_ = auVar124._0_2_;
  auVar88._0_2_ = auVar124._0_2_;
  fVar259 = (float)((int)CONCAT11((undefined1)local_428,local_418[0]) >> 8);
  fVar307 = (float)(auVar88._0_4_ >> 0x18);
  auVar263._0_8_ = CONCAT44(fVar307,fVar259);
  auVar263._8_4_ = (float)(auVar272._8_4_ >> 0x18);
  auVar275._12_4_ = (float)(auVar273._12_4_ >> 0x18);
  auVar275._0_12_ = auVar263;
  auVar102[0xd] = 0;
  auVar102._0_13_ = auVar275._0_13_;
  auVar102[0xe] = (char)((uint)fVar307 >> 0x18);
  auVar107[0xc] = (char)((uint)fVar307 >> 0x10);
  auVar107._0_12_ = auVar263;
  auVar107._13_2_ = auVar102._13_2_;
  auVar110[0xb] = 0;
  auVar110._0_11_ = auVar263._0_11_;
  auVar110._12_3_ = auVar107._12_3_;
  auVar113[10] = (char)((uint)fVar307 >> 8);
  auVar113._0_10_ = auVar263._0_10_;
  auVar113._11_4_ = auVar110._11_4_;
  auVar116[9] = 0;
  auVar116._0_9_ = auVar263._0_9_;
  auVar116._10_5_ = auVar113._10_5_;
  auVar119[8] = SUB41(fVar307,0);
  auVar119._0_8_ = auVar263._0_8_;
  auVar119._9_6_ = auVar116._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar119._8_7_,uVar187),(char)((uint)fVar259 >> 0x18));
  auVar122._6_9_ = Var80;
  auVar122[5] = uVar185;
  auVar122[4] = (char)((uint)fVar259 >> 0x10);
  auVar122._0_4_ = fVar259;
  auVar125._2_11_ = auVar122._4_11_;
  auVar125[1] = cVar184;
  auVar125[0] = (char)((uint)fVar259 >> 8);
  sVar142 = CONCAT11(cVar141,SUB41(fVar259,0));
  auVar128._2_13_ = auVar125;
  auVar128._0_2_ = sVar142;
  uVar186 = (undefined2)Var80;
  auVar278._0_12_ = auVar128._0_12_;
  auVar278._12_2_ = uVar186;
  auVar278._14_2_ = uVar186;
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._0_10_ = auVar128._0_10_;
  auVar277._10_2_ = auVar122._4_2_;
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._0_8_ = auVar128._0_8_;
  auVar276._8_2_ = auVar122._4_2_;
  auVar89._4_8_ = auVar276._8_8_;
  auVar89._2_2_ = auVar125._0_2_;
  auVar89._0_2_ = auVar125._0_2_;
  iVar306 = (int)sVar142 >> 8;
  iVar308 = auVar89._0_4_ >> 0x18;
  auVar264._0_8_ = CONCAT44(iVar308,iVar306);
  auVar264._8_4_ = auVar276._8_4_ >> 0x18;
  auVar279._12_4_ = auVar277._12_4_ >> 0x18;
  auVar279._0_12_ = auVar264;
  fVar413 = (float)iVar308;
  cVar191 = cVar184 >> 7;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar279._0_13_;
  auVar41[0xe] = cVar191;
  auVar46[0xc] = cVar191;
  auVar46._0_12_ = auVar264;
  auVar46._13_2_ = auVar41._13_2_;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar264._0_11_;
  auVar51._12_3_ = auVar46._12_3_;
  auVar56[10] = cVar191;
  auVar56._0_10_ = auVar264._0_10_;
  auVar56._11_4_ = auVar51._11_4_;
  auVar61[9] = 0;
  auVar61._0_9_ = auVar264._0_9_;
  auVar61._10_5_ = auVar56._10_5_;
  auVar66[8] = cVar184;
  auVar66._0_8_ = auVar264._0_8_;
  auVar66._9_6_ = auVar61._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar66._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar141 >> 7);
  auVar71._6_9_ = Var80;
  auVar71[5] = (char)((uint)uVar19 >> 0x10);
  auVar71[4] = (undefined1)((short)cVar141 >> 7);
  auVar71._0_4_ = iVar306;
  cVar191 = (char)((uint)uVar19 >> 8);
  auVar90._2_11_ = auVar71._4_11_;
  auVar90[1] = cVar191;
  auVar90[0] = (undefined1)((short)cVar141 >> 7);
  cVar184 = (char)uVar19;
  auVar76._2_13_ = auVar90;
  auVar76._0_2_ = CONCAT11(cVar184,cVar141);
  uVar186 = (undefined2)Var80;
  auVar282._0_12_ = auVar76._0_12_;
  auVar282._12_2_ = uVar186;
  auVar282._14_2_ = uVar186;
  auVar281._12_4_ = auVar282._12_4_;
  auVar281._0_10_ = auVar76._0_10_;
  auVar281._10_2_ = auVar71._4_2_;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280._0_8_ = auVar76._0_8_;
  auVar280._8_2_ = auVar71._4_2_;
  auVar91._4_8_ = auVar280._8_8_;
  auVar91._2_2_ = auVar90._0_2_;
  auVar91._0_2_ = auVar90._0_2_;
  iVar308 = (int)CONCAT11(cVar184,cVar141) >> 8;
  iVar309 = auVar91._0_4_ >> 0x18;
  auVar265._0_8_ = CONCAT44(iVar309,iVar308);
  auVar265._8_4_ = auVar280._8_4_ >> 0x18;
  auVar283._12_4_ = auVar281._12_4_ >> 0x18;
  auVar283._0_12_ = auVar265;
  fVar445 = (float)iVar309;
  cVar141 = cVar191 >> 7;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar283._0_13_;
  auVar42[0xe] = cVar141;
  auVar47[0xc] = cVar141;
  auVar47._0_12_ = auVar265;
  auVar47._13_2_ = auVar42._13_2_;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar265._0_11_;
  auVar52._12_3_ = auVar47._12_3_;
  auVar57[10] = cVar141;
  auVar57._0_10_ = auVar265._0_10_;
  auVar57._11_4_ = auVar52._11_4_;
  auVar62[9] = 0;
  auVar62._0_9_ = auVar265._0_9_;
  auVar62._10_5_ = auVar57._10_5_;
  auVar67[8] = cVar191;
  auVar67._0_8_ = auVar265._0_8_;
  auVar67._9_6_ = auVar62._9_6_;
  Var80 = CONCAT81(CONCAT71(auVar67._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar184 >> 7);
  auVar72._6_9_ = Var80;
  auVar72[5] = (char)((uint)uVar20 >> 0x10);
  auVar72[4] = (undefined1)((short)cVar184 >> 7);
  auVar72._0_4_ = iVar308;
  auVar92._2_11_ = auVar72._4_11_;
  auVar92[1] = (char)((uint)uVar20 >> 8);
  auVar92[0] = (undefined1)((short)cVar184 >> 7);
  sVar142 = CONCAT11((char)uVar20,cVar184);
  auVar77._2_13_ = auVar92;
  auVar77._0_2_ = sVar142;
  uVar186 = (undefined2)Var80;
  auVar286._0_12_ = auVar77._0_12_;
  auVar286._12_2_ = uVar186;
  auVar286._14_2_ = uVar186;
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._0_10_ = auVar77._0_10_;
  auVar285._10_2_ = auVar72._4_2_;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._0_8_ = auVar77._0_8_;
  auVar284._8_2_ = auVar72._4_2_;
  auVar93._4_8_ = auVar284._8_8_;
  auVar93._2_2_ = auVar92._0_2_;
  auVar93._0_2_ = auVar92._0_2_;
  fVar417 = (float)((int)sVar142 >> 8);
  fVar423 = (float)(auVar93._0_4_ >> 0x18);
  fVar425 = (float)(auVar284._8_4_ >> 0x18);
  fVar260 = fVar428 * (float)iVar190 + fVar433 * (float)iVar143 + fVar435 * (float)iVar188;
  fVar310 = fVar428 * fVar348 + fVar433 * fVar369 + fVar435 * fVar397;
  fVar311 = fVar428 * (float)auVar262._8_4_ +
            fVar433 * (float)auVar144._8_4_ + fVar435 * (float)auVar145._8_4_;
  fVar314 = fVar428 * (float)auVar271._12_4_ +
            fVar433 * (float)auVar232._12_4_ + fVar435 * (float)auVar149._12_4_;
  fVar442 = fVar428 * fVar259 + fVar433 * (float)iVar189 + fVar258;
  fVar446 = fVar428 * fVar307 + fVar433 * fVar357 + fVar305;
  fVar447 = fVar428 * auVar263._8_4_ + fVar433 * (float)auVar146._8_4_ + auVar261._8_4_;
  fVar448 = fVar428 * auVar275._12_4_ + fVar433 * (float)auVar153._12_4_ + auVar267._12_4_;
  fVar258 = fVar428 * (float)iVar306 + fVar433 * (float)iVar308 + fVar435 * fVar417;
  fVar305 = fVar428 * fVar413 + fVar433 * fVar445 + fVar435 * fVar423;
  fVar192 = fVar428 * (float)auVar264._8_4_ + fVar433 * (float)auVar265._8_4_ + fVar435 * fVar425;
  fVar435 = fVar428 * (float)auVar279._12_4_ +
            fVar433 * (float)auVar283._12_4_ + fVar435 * (float)(auVar285._12_4_ >> 0x18);
  uVar245 = *(undefined8 *)(prim + uVar130 * 7 + 6);
  uVar131 = *(ulong *)(prim + uVar130 * 0xb + 6);
  _fStack_360 = 0;
  _local_368 = uVar131;
  auVar294 = _local_368;
  uVar7 = *(undefined8 *)(prim + uVar130 * 9 + 6);
  uVar8 = *(undefined8 *)(prim + uVar130 * 0xd + 6);
  uVar9 = *(undefined8 *)(prim + uVar130 * 0x12 + 6);
  uStack_350 = 0;
  fVar429 = (float)iVar190 * fVar317 + (float)iVar143 * fVar339 + (float)iVar188 * fVar340;
  fVar434 = fVar348 * fVar317 + fVar369 * fVar339 + fVar397 * fVar340;
  fVar436 = (float)auVar262._8_4_ * fVar317 +
            (float)auVar144._8_4_ * fVar339 + (float)auVar145._8_4_ * fVar340;
  fVar437 = (float)auVar271._12_4_ * fVar317 +
            (float)auVar232._12_4_ * fVar339 + (float)auVar149._12_4_ * fVar340;
  fVar428 = fVar259 * fVar317 + (float)iVar189 * fVar339 + fVar370 * fVar340;
  fVar433 = fVar307 * fVar317 + fVar357 * fVar339 + fVar381 * fVar340;
  fVar254 = auVar263._8_4_ * fVar317 + (float)auVar146._8_4_ * fVar339 + fVar384 * fVar340;
  fVar256 = auVar275._12_4_ * fVar317 +
            (float)auVar153._12_4_ * fVar339 + (float)(auVar155._12_4_ >> 0x18) * fVar340;
  fVar384 = fVar317 * (float)iVar306 + fVar339 * (float)iVar308 + fVar340 * fVar417;
  fVar397 = fVar317 * fVar413 + fVar339 * fVar445 + fVar340 * fVar423;
  fVar413 = fVar317 * (float)auVar264._8_4_ + fVar339 * (float)auVar265._8_4_ + fVar340 * fVar425;
  fVar417 = fVar317 * (float)auVar279._12_4_ +
            fVar339 * (float)auVar283._12_4_ + fVar340 * (float)(auVar285._12_4_ >> 0x18);
  auVar246._0_4_ = (float)DAT_01f4bd50;
  fVar259 = DAT_01f4bd50._4_4_;
  fVar307 = DAT_01f4bd50._8_4_;
  auVar249._0_12_ = DAT_01f4bd50._0_12_;
  fVar317 = DAT_01f4bd50._12_4_;
  uVar137 = -(uint)(auVar246._0_4_ <= ABS(fVar260));
  uVar138 = -(uint)(fVar259 <= ABS(fVar310));
  uVar139 = -(uint)(fVar307 <= ABS(fVar311));
  uVar140 = -(uint)(fVar317 <= ABS(fVar314));
  auVar287._0_4_ = (uint)fVar260 & uVar137;
  auVar287._4_4_ = (uint)fVar310 & uVar138;
  auVar287._8_4_ = (uint)fVar311 & uVar139;
  auVar287._12_4_ = (uint)fVar314 & uVar140;
  auVar215._0_4_ = ~uVar137 & (uint)auVar246._0_4_;
  auVar215._4_4_ = ~uVar138 & (uint)fVar259;
  auVar215._8_4_ = ~uVar139 & (uint)fVar307;
  auVar215._12_4_ = ~uVar140 & (uint)fVar317;
  auVar215 = auVar215 | auVar287;
  uVar137 = -(uint)(auVar246._0_4_ <= ABS(fVar442));
  uVar138 = -(uint)(fVar259 <= ABS(fVar446));
  uVar139 = -(uint)(fVar307 <= ABS(fVar447));
  uVar140 = -(uint)(fVar317 <= ABS(fVar448));
  auVar443._0_4_ = (uint)fVar442 & uVar137;
  auVar443._4_4_ = (uint)fVar446 & uVar138;
  auVar443._8_4_ = (uint)fVar447 & uVar139;
  auVar443._12_4_ = (uint)fVar448 & uVar140;
  auVar288._0_4_ = ~uVar137 & (uint)auVar246._0_4_;
  auVar288._4_4_ = ~uVar138 & (uint)fVar259;
  auVar288._8_4_ = ~uVar139 & (uint)fVar307;
  auVar288._12_4_ = ~uVar140 & (uint)fVar317;
  auVar288 = auVar288 | auVar443;
  uVar137 = -(uint)(auVar246._0_4_ <= ABS(fVar258));
  uVar138 = -(uint)(fVar259 <= ABS(fVar305));
  uVar139 = -(uint)(fVar307 <= ABS(fVar192));
  uVar140 = -(uint)(fVar317 <= ABS(fVar435));
  auVar157._0_4_ = (uint)fVar258 & uVar137;
  auVar157._4_4_ = (uint)fVar305 & uVar138;
  auVar157._8_4_ = (uint)fVar192 & uVar139;
  auVar157._12_4_ = (uint)fVar435 & uVar140;
  auVar320._0_4_ = ~uVar137 & (uint)auVar246._0_4_;
  auVar320._4_4_ = ~uVar138 & (uint)fVar259;
  auVar320._8_4_ = ~uVar139 & (uint)fVar307;
  auVar320._12_4_ = ~uVar140 & (uint)fVar317;
  auVar320 = auVar320 | auVar157;
  auVar158 = rcpps(auVar157,auVar215);
  fVar435 = auVar158._0_4_;
  fVar192 = auVar158._4_4_;
  fVar311 = auVar158._8_4_;
  fVar369 = auVar158._12_4_;
  fVar435 = (1.0 - auVar215._0_4_ * fVar435) * fVar435 + fVar435;
  fVar192 = (1.0 - auVar215._4_4_ * fVar192) * fVar192 + fVar192;
  fVar311 = (1.0 - auVar215._8_4_ * fVar311) * fVar311 + fVar311;
  fVar369 = (1.0 - auVar215._12_4_ * fVar369) * fVar369 + fVar369;
  auVar158 = rcpps(auVar158,auVar288);
  fVar258 = auVar158._0_4_;
  auVar289._0_4_ = auVar288._0_4_ * fVar258;
  fVar259 = auVar158._4_4_;
  fVar317 = auVar288._4_4_ * fVar259;
  auVar266._0_8_ = CONCAT44(fVar317,auVar289._0_4_);
  fVar314 = auVar158._8_4_;
  auVar266._8_4_ = auVar288._8_4_ * fVar314;
  fVar370 = auVar158._12_4_;
  fVar258 = (1.0 - auVar289._0_4_) * fVar258 + fVar258;
  fVar259 = (1.0 - fVar317) * fVar259 + fVar259;
  fVar314 = (1.0 - auVar266._8_4_) * fVar314 + fVar314;
  fVar370 = (1.0 - auVar288._12_4_ * fVar370) * fVar370 + fVar370;
  auVar158 = rcpps(auVar158,auVar320);
  fVar305 = auVar158._0_4_;
  auVar321._0_4_ = auVar320._0_4_ * fVar305;
  fVar307 = auVar158._4_4_;
  fVar260 = auVar320._4_4_ * fVar307;
  auVar318._0_8_ = CONCAT44(fVar260,auVar321._0_4_);
  fVar339 = auVar158._8_4_;
  auVar318._8_4_ = auVar320._8_4_ * fVar339;
  fVar381 = auVar158._12_4_;
  uVar135 = *(ulong *)(prim + uVar130 * 0x16 + 6);
  fVar305 = (1.0 - auVar321._0_4_) * fVar305 + fVar305;
  fVar307 = (1.0 - fVar260) * fVar307 + fVar307;
  fVar339 = (1.0 - auVar318._8_4_) * fVar339 + fVar339;
  fVar381 = (1.0 - auVar320._12_4_ * fVar381) * fVar381 + fVar381;
  uVar10 = *(ulong *)(prim + uVar130 * 0x14 + 6);
  local_408._0_2_ = (undefined2)uVar245;
  local_408._2_2_ = (undefined2)((ulong)uVar245 >> 0x10);
  local_408._4_2_ = (undefined2)((ulong)uVar245 >> 0x20);
  uStack_402 = (undefined2)((ulong)uVar245 >> 0x30);
  auVar249._12_2_ = DAT_01f4bd50._6_2_;
  auVar249._14_2_ = uStack_402;
  auVar248._12_4_ = auVar249._12_4_;
  auVar248._0_10_ = (unkbyte10)DAT_01f4bd50;
  auVar248._10_2_ = local_408._4_2_;
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._0_8_ = (undefined8)DAT_01f4bd50;
  auVar247._8_2_ = DAT_01f4bd50._4_2_;
  auVar246._8_8_ = auVar247._8_8_;
  auVar246._6_2_ = local_408._2_2_;
  auVar246._4_2_ = DAT_01f4bd50._2_2_;
  fVar423 = (float)(auVar246._4_4_ >> 0x10);
  fVar425 = (float)(auVar247._8_4_ >> 0x10);
  local_368._0_2_ = (undefined2)uVar131;
  local_368._2_2_ = (undefined2)(uVar131 >> 0x10);
  local_368._4_2_ = (undefined2)(uVar131 >> 0x20);
  uStack_362 = (undefined2)(uVar131 >> 0x30);
  auVar292._12_2_ = (short)((uint)fVar317 >> 0x10);
  auVar292._0_12_ = auVar266;
  auVar292._14_2_ = uStack_362;
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._0_10_ = auVar266._0_10_;
  auVar291._10_2_ = local_368._4_2_;
  auVar290._10_6_ = auVar291._10_6_;
  auVar290._8_2_ = SUB42(fVar317,0);
  auVar290._0_8_ = auVar266._0_8_;
  auVar289._8_8_ = auVar290._8_8_;
  auVar289._6_2_ = local_368._2_2_;
  auVar289._4_2_ = (short)((uint)auVar289._0_4_ >> 0x10);
  uVar245 = *(undefined8 *)(prim + uVar130 * 0x18 + 6);
  auVar324._12_2_ = (short)((uint)fVar260 >> 0x10);
  auVar324._0_12_ = auVar318;
  auVar324._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar323._12_4_ = auVar324._12_4_;
  auVar323._0_10_ = auVar318._0_10_;
  auVar323._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar322._10_6_ = auVar323._10_6_;
  auVar322._8_2_ = SUB42(fVar260,0);
  auVar322._0_8_ = auVar318._0_8_;
  auVar321._8_8_ = auVar322._8_8_;
  sVar142 = (short)((ulong)uVar7 >> 0x10);
  auVar321._6_2_ = sVar142;
  auVar321._4_2_ = (short)((uint)auVar321._0_4_ >> 0x10);
  auVar325._0_4_ = (int)(short)uVar7;
  iVar143 = auVar321._4_4_ >> 0x10;
  auVar319._0_8_ = CONCAT44(iVar143,auVar325._0_4_);
  auVar319._8_4_ = auVar322._8_4_ >> 0x10;
  auVar342._0_4_ = (float)auVar325._0_4_;
  fVar442 = (float)iVar143;
  auVar341._0_8_ = CONCAT44(fVar442,auVar342._0_4_);
  auVar341._8_4_ = (float)auVar319._8_4_;
  auVar328._12_2_ = sVar142 >> 0xf;
  auVar328._0_12_ = auVar319;
  auVar328._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar327._12_4_ = auVar328._12_4_;
  auVar327._0_10_ = auVar319._0_10_;
  auVar327._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar326._10_6_ = auVar327._10_6_;
  auVar326._8_2_ = sVar142;
  auVar326._0_8_ = auVar319._0_8_;
  auVar325._8_8_ = auVar326._8_8_;
  auVar325._6_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar325._4_2_ = (short)uVar7 >> 0xf;
  local_358._0_2_ = (short)uVar9;
  local_358._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
  local_358._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
  local_358._6_2_ = (undefined2)((ulong)uVar9 >> 0x30);
  auVar345._12_2_ = (short)((uint)fVar442 >> 0x10);
  auVar345._0_12_ = auVar341;
  auVar345._14_2_ = local_358._6_2_;
  auVar344._12_4_ = auVar345._12_4_;
  auVar344._0_10_ = auVar341._0_10_;
  auVar344._10_2_ = local_358._4_2_;
  auVar343._10_6_ = auVar344._10_6_;
  auVar343._8_2_ = SUB42(fVar442,0);
  auVar343._0_8_ = auVar341._0_8_;
  auVar342._8_8_ = auVar343._8_8_;
  auVar342._6_2_ = local_358._2_2_;
  auVar342._4_2_ = (short)((uint)auVar342._0_4_ >> 0x10);
  fVar445 = (float)(auVar342._4_4_ >> 0x10);
  fVar446 = (float)(auVar343._8_4_ >> 0x10);
  uVar186 = (undefined2)(uVar135 >> 0x30);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar135;
  auVar218._12_2_ = uVar186;
  auVar218._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar135 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar135;
  auVar217._10_2_ = uVar186;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar186;
  auVar216._0_8_ = uVar135;
  sVar142 = (short)(uVar135 >> 0x10);
  auVar94._4_8_ = auVar216._8_8_;
  auVar94._2_2_ = sVar142;
  auVar94._0_2_ = sVar142;
  auVar219._0_4_ = (int)(short)uVar135;
  iVar143 = auVar94._0_4_ >> 0x10;
  auVar214._0_8_ = CONCAT44(iVar143,auVar219._0_4_);
  auVar214._8_4_ = auVar216._8_4_ >> 0x10;
  uVar186 = (undefined2)(uVar10 >> 0x30);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar10;
  auVar161._12_2_ = uVar186;
  auVar161._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar10 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar10;
  auVar160._10_2_ = uVar186;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar186;
  auVar159._0_8_ = uVar10;
  uVar186 = (undefined2)(uVar10 >> 0x10);
  auVar95._4_8_ = auVar159._8_8_;
  auVar95._2_2_ = uVar186;
  auVar95._0_2_ = uVar186;
  fVar317 = (float)(auVar95._0_4_ >> 0x10);
  fVar340 = (float)(auVar159._8_4_ >> 0x10);
  auVar222._12_2_ = sVar142 >> 0xf;
  auVar222._0_12_ = auVar214;
  auVar222._14_2_ = (short)((ulong)uVar245 >> 0x30);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._0_10_ = auVar214._0_10_;
  auVar221._10_2_ = (short)((ulong)uVar245 >> 0x20);
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = sVar142;
  auVar220._0_8_ = auVar214._0_8_;
  auVar219._8_8_ = auVar220._8_8_;
  auVar219._6_2_ = (short)((ulong)uVar245 >> 0x10);
  auVar219._4_2_ = (short)uVar135 >> 0xf;
  uVar131 = *(ulong *)(prim + uVar130 * 0x1d + 6);
  uVar186 = (undefined2)(uVar131 >> 0x30);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar131;
  auVar164._12_2_ = uVar186;
  auVar164._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar131 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar131;
  auVar163._10_2_ = uVar186;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar186;
  auVar162._0_8_ = uVar131;
  uVar186 = (undefined2)(uVar131 >> 0x10);
  auVar96._4_8_ = auVar162._8_8_;
  auVar96._2_2_ = uVar186;
  auVar96._0_2_ = uVar186;
  fVar260 = (float)(auVar96._0_4_ >> 0x10);
  fVar348 = (float)(auVar162._8_4_ >> 0x10);
  uVar135 = *(ulong *)(prim + uVar130 * 0x21 + 6);
  uVar186 = (undefined2)(uVar135 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar135;
  auVar225._12_2_ = uVar186;
  auVar225._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar135 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar135;
  auVar224._10_2_ = uVar186;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar186;
  auVar223._0_8_ = uVar135;
  uVar186 = (undefined2)(uVar135 >> 0x10);
  auVar97._4_8_ = auVar223._8_8_;
  auVar97._2_2_ = uVar186;
  auVar97._0_2_ = uVar186;
  uVar11 = *(ulong *)(prim + uVar130 * 0x1f + 6);
  uVar186 = (undefined2)(uVar11 >> 0x30);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar11;
  auVar167._12_2_ = uVar186;
  auVar167._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar11 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar11;
  auVar166._10_2_ = uVar186;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar186;
  auVar165._0_8_ = uVar11;
  uVar186 = (undefined2)(uVar11 >> 0x10);
  auVar98._4_8_ = auVar165._8_8_;
  auVar98._2_2_ = uVar186;
  auVar98._0_2_ = uVar186;
  fVar310 = (float)(auVar98._0_4_ >> 0x10);
  fVar357 = (float)(auVar165._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar130 * 0x23 + 6);
  uVar186 = (undefined2)(uVar12 >> 0x30);
  auVar228._8_4_ = 0;
  auVar228._0_8_ = uVar12;
  auVar228._12_2_ = uVar186;
  auVar228._14_2_ = uVar186;
  uVar186 = (undefined2)(uVar12 >> 0x20);
  auVar227._12_4_ = auVar228._12_4_;
  auVar227._8_2_ = 0;
  auVar227._0_8_ = uVar12;
  auVar227._10_2_ = uVar186;
  auVar226._10_6_ = auVar227._10_6_;
  auVar226._8_2_ = uVar186;
  auVar226._0_8_ = uVar12;
  uVar186 = (undefined2)(uVar12 >> 0x10);
  auVar99._4_8_ = auVar226._8_8_;
  auVar99._2_2_ = uVar186;
  auVar99._0_2_ = uVar186;
  auVar293._0_8_ =
       CONCAT44(((((float)(auVar289._4_4_ >> 0x10) - fVar423) * fVar438 + fVar423) - fVar434) *
                fVar192,((((float)(int)(short)local_368._0_2_ - (float)(int)(short)local_408._0_2_)
                          * fVar438 + (float)(int)(short)local_408._0_2_) - fVar429) * fVar435);
  auVar293._8_4_ =
       ((((float)(auVar290._8_4_ >> 0x10) - fVar425) * fVar438 + fVar425) - fVar436) * fVar311;
  auVar293._12_4_ =
       ((((float)(auVar291._12_4_ >> 0x10) - (float)(auVar248._12_4_ >> 0x10)) * fVar438 +
        (float)(auVar248._12_4_ >> 0x10)) - fVar437) * fVar369;
  auVar329._0_4_ =
       ((((float)(int)(short)uVar8 - auVar342._0_4_) * fVar438 + auVar342._0_4_) - fVar429) *
       fVar435;
  auVar329._4_4_ =
       ((((float)(auVar325._4_4_ >> 0x10) - fVar442) * fVar438 + fVar442) - fVar434) * fVar192;
  auVar329._8_4_ =
       ((((float)(auVar326._8_4_ >> 0x10) - auVar341._8_4_) * fVar438 + auVar341._8_4_) - fVar436) *
       fVar311;
  auVar329._12_4_ =
       ((((float)(auVar327._12_4_ >> 0x10) - (float)(auVar323._12_4_ >> 0x10)) * fVar438 +
        (float)(auVar323._12_4_ >> 0x10)) - fVar437) * fVar369;
  auVar346._0_8_ =
       CONCAT44(((((float)iVar143 - fVar445) * fVar438 + fVar445) - fVar433) * fVar259,
                ((((float)auVar219._0_4_ - (float)(int)(short)local_358) * fVar438 +
                 (float)(int)(short)local_358) - fVar428) * fVar258);
  auVar346._8_4_ = ((((float)auVar214._8_4_ - fVar446) * fVar438 + fVar446) - fVar254) * fVar314;
  auVar346._12_4_ =
       ((((float)(auVar217._12_4_ >> 0x10) - (float)(auVar344._12_4_ >> 0x10)) * fVar438 +
        (float)(auVar344._12_4_ >> 0x10)) - fVar256) * fVar370;
  auVar373._0_4_ =
       ((((float)(int)(short)uVar245 - (float)(int)(short)uVar10) * fVar438 +
        (float)(int)(short)uVar10) - fVar428) * fVar258;
  auVar373._4_4_ =
       ((((float)(auVar219._4_4_ >> 0x10) - fVar317) * fVar438 + fVar317) - fVar433) * fVar259;
  auVar373._8_4_ =
       ((((float)(auVar220._8_4_ >> 0x10) - fVar340) * fVar438 + fVar340) - fVar254) * fVar314;
  auVar373._12_4_ =
       ((((float)(auVar221._12_4_ >> 0x10) - (float)(auVar160._12_4_ >> 0x10)) * fVar438 +
        (float)(auVar160._12_4_ >> 0x10)) - fVar256) * fVar370;
  auVar408._0_8_ =
       CONCAT44(((((float)(auVar97._0_4_ >> 0x10) - fVar260) * fVar438 + fVar260) - fVar397) *
                fVar307,((((float)(int)(short)uVar135 - (float)(int)(short)uVar131) * fVar438 +
                         (float)(int)(short)uVar131) - fVar384) * fVar305);
  auVar408._8_4_ =
       ((((float)(auVar223._8_4_ >> 0x10) - fVar348) * fVar438 + fVar348) - fVar413) * fVar339;
  auVar408._12_4_ =
       ((((float)(auVar224._12_4_ >> 0x10) - (float)(auVar163._12_4_ >> 0x10)) * fVar438 +
        (float)(auVar163._12_4_ >> 0x10)) - fVar417) * fVar381;
  auVar419._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar438 +
        (float)(int)(short)uVar11) - fVar384) * fVar305;
  auVar419._4_4_ =
       ((((float)(auVar99._0_4_ >> 0x10) - fVar310) * fVar438 + fVar310) - fVar397) * fVar307;
  auVar419._8_4_ =
       ((((float)(auVar226._8_4_ >> 0x10) - fVar357) * fVar438 + fVar357) - fVar413) * fVar339;
  auVar419._12_4_ =
       ((((float)(auVar227._12_4_ >> 0x10) - (float)(auVar166._12_4_ >> 0x10)) * fVar438 +
        (float)(auVar166._12_4_ >> 0x10)) - fVar417) * fVar381;
  auVar229._8_4_ = auVar293._8_4_;
  auVar229._0_8_ = auVar293._0_8_;
  auVar229._12_4_ = auVar293._12_4_;
  auVar230 = minps(auVar229,auVar329);
  auVar168._8_4_ = auVar346._8_4_;
  auVar168._0_8_ = auVar346._0_8_;
  auVar168._12_4_ = auVar346._12_4_;
  auVar158 = minps(auVar168,auVar373);
  auVar230 = maxps(auVar230,auVar158);
  auVar169._8_4_ = auVar408._8_4_;
  auVar169._0_8_ = auVar408._0_8_;
  auVar169._12_4_ = auVar408._12_4_;
  auVar158 = minps(auVar169,auVar419);
  uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar193._4_4_ = uVar5;
  auVar193._0_4_ = uVar5;
  auVar193._8_4_ = uVar5;
  auVar193._12_4_ = uVar5;
  auVar158 = maxps(auVar158,auVar193);
  auVar158 = maxps(auVar230,auVar158);
  local_1c8 = auVar158._0_4_ * 0.99999964;
  fStack_1c4 = auVar158._4_4_ * 0.99999964;
  fStack_1c0 = auVar158._8_4_ * 0.99999964;
  fStack_1bc = auVar158._12_4_ * 0.99999964;
  auVar158 = maxps(auVar293,auVar329);
  auVar230 = maxps(auVar346,auVar373);
  auVar158 = minps(auVar158,auVar230);
  auVar230 = maxps(auVar408,auVar419);
  fVar435 = (ray->super_RayK<1>).tfar;
  auVar194._4_4_ = fVar435;
  auVar194._0_4_ = fVar435;
  auVar194._8_4_ = fVar435;
  auVar194._12_4_ = fVar435;
  auVar230 = minps(auVar230,auVar194);
  auVar158 = minps(auVar158,auVar230);
  auVar195._0_4_ = -(uint)(PVar13 != (Primitive)0x0 && local_1c8 <= auVar158._0_4_ * 1.0000004);
  auVar195._4_4_ = -(uint)(1 < (byte)PVar13 && fStack_1c4 <= auVar158._4_4_ * 1.0000004);
  auVar195._8_4_ = -(uint)(2 < (byte)PVar13 && fStack_1c0 <= auVar158._8_4_ * 1.0000004);
  auVar195._12_4_ = -(uint)(3 < (byte)PVar13 && fStack_1bc <= auVar158._12_4_ * 1.0000004);
  uVar137 = movmskps((int)(uVar130 * 0x21),auVar195);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  _local_368 = auVar294;
  local_358 = uVar9;
  local_290 = prim;
LAB_0038b3cd:
  if (uVar137 == 0) {
    return;
  }
  lVar133 = 0;
  if (uVar137 != 0) {
    for (; (uVar137 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
    }
  }
  uVar138 = *(uint *)(local_290 + 2);
  uVar139 = *(uint *)(local_290 + lVar133 * 4 + 6);
  pGVar21 = (context->scene->geometries).items[uVar138].ptr;
  fVar435 = pGVar21->fnumTimeSegments;
  fVar258 = (pGVar21->time_range).lower;
  fVar305 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar258) /
            ((pGVar21->time_range).upper - fVar258)) * fVar435;
  fVar258 = floorf(fVar305);
  fVar435 = fVar435 + -1.0;
  if (fVar435 <= fVar258) {
    fVar258 = fVar435;
  }
  fVar435 = 0.0;
  if (0.0 <= fVar258) {
    fVar435 = fVar258;
  }
  fVar305 = fVar305 - fVar435;
  local_340 = (ulong)uVar139;
  uVar131 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                            (ulong)uVar139 *
                            pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar134 = (long)(int)fVar435 * 0x38;
  lVar23 = *(long *)(_Var22 + lVar134);
  lVar24 = *(long *)(_Var22 + 0x10 + lVar134);
  pfVar3 = (float *)(lVar23 + lVar24 * uVar131);
  fVar435 = *pfVar3;
  fVar258 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar259 = pfVar3[3];
  lVar133 = uVar131 + 1;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar133);
  fVar307 = *pfVar3;
  fVar317 = pfVar3[1];
  fVar260 = pfVar3[2];
  fVar310 = pfVar3[3];
  lVar1 = uVar131 + 2;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar1);
  fVar311 = *pfVar3;
  fVar314 = pfVar3[1];
  fVar339 = pfVar3[2];
  fVar340 = pfVar3[3];
  lVar2 = uVar131 + 3;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar2);
  fVar348 = *pfVar3;
  fVar357 = pfVar3[1];
  fVar369 = pfVar3[2];
  fVar370 = pfVar3[3];
  lVar23 = *(long *)&pGVar21[4].fnumTimeSegments;
  lVar24 = *(long *)(lVar23 + lVar134);
  lVar25 = *(long *)(lVar23 + 0x10 + lVar134);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar131);
  fVar381 = *pfVar3;
  fVar384 = pfVar3[1];
  fVar397 = pfVar3[2];
  fVar413 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar133);
  fVar417 = *pfVar3;
  fVar428 = pfVar3[1];
  fVar433 = pfVar3[2];
  fVar423 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar254 = *pfVar3;
  fVar425 = pfVar3[1];
  fVar256 = pfVar3[2];
  fVar442 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar445 = *pfVar3;
  fVar446 = pfVar3[1];
  fVar429 = pfVar3[2];
  fVar434 = pfVar3[3];
  fVar436 = fVar435 * 0.16666667 + fVar307 * 0.6666667 + fVar311 * 0.16666667 + fVar348 * 0.0;
  fVar437 = fVar258 * 0.16666667 + fVar317 * 0.6666667 + fVar314 * 0.16666667 + fVar357 * 0.0;
  fVar438 = fVar192 * 0.16666667 + fVar260 * 0.6666667 + fVar339 * 0.16666667 + fVar369 * 0.0;
  fVar447 = fVar259 * 0.16666667 + fVar310 * 0.6666667 + fVar340 * 0.16666667 + fVar370 * 0.0;
  fVar213 = ((fVar311 * 0.5 + fVar348 * 0.0) - fVar307 * 0.0) - fVar435 * 0.5;
  fVar241 = ((fVar314 * 0.5 + fVar357 * 0.0) - fVar317 * 0.0) - fVar258 * 0.5;
  fVar242 = ((fVar339 * 0.5 + fVar369 * 0.0) - fVar260 * 0.0) - fVar192 * 0.5;
  fVar243 = ((fVar340 * 0.5 + fVar370 * 0.0) - fVar310 * 0.0) - fVar259 * 0.5;
  fVar418 = fVar381 * 0.16666667 + fVar417 * 0.6666667 + fVar254 * 0.16666667 + fVar445 * 0.0;
  fVar424 = fVar384 * 0.16666667 + fVar428 * 0.6666667 + fVar425 * 0.16666667 + fVar446 * 0.0;
  fVar426 = fVar397 * 0.16666667 + fVar433 * 0.6666667 + fVar256 * 0.16666667 + fVar429 * 0.0;
  fVar427 = fVar413 * 0.16666667 + fVar423 * 0.6666667 + fVar442 * 0.16666667 + fVar434 * 0.0;
  fVar407 = ((fVar254 * 0.5 + fVar445 * 0.0) - fVar417 * 0.0) - fVar381 * 0.5;
  fVar414 = ((fVar425 * 0.5 + fVar446 * 0.0) - fVar428 * 0.0) - fVar384 * 0.5;
  fVar415 = ((fVar256 * 0.5 + fVar429 * 0.0) - fVar433 * 0.0) - fVar397 * 0.5;
  fVar416 = ((fVar442 * 0.5 + fVar434 * 0.0) - fVar423 * 0.0) - fVar413 * 0.5;
  fVar244 = fVar307 * 0.16666667 + fVar311 * 0.6666667 + fVar348 * 0.16666667 + fVar435 * 0.0;
  fVar253 = fVar317 * 0.16666667 + fVar314 * 0.6666667 + fVar357 * 0.16666667 + fVar258 * 0.0;
  fVar255 = fVar260 * 0.16666667 + fVar339 * 0.6666667 + fVar369 * 0.16666667 + fVar192 * 0.0;
  fVar257 = fVar310 * 0.16666667 + fVar340 * 0.6666667 + fVar370 * 0.16666667 + fVar259 * 0.0;
  fVar448 = ((fVar311 * 0.0 + fVar348 * 0.5) - fVar307 * 0.5) - fVar435 * 0.0;
  fVar209 = ((fVar314 * 0.0 + fVar357 * 0.5) - fVar317 * 0.5) - fVar258 * 0.0;
  fVar210 = ((fVar339 * 0.0 + fVar369 * 0.5) - fVar260 * 0.5) - fVar192 * 0.0;
  fVar211 = ((fVar340 * 0.0 + fVar370 * 0.5) - fVar310 * 0.5) - fVar259 * 0.0;
  fVar307 = fVar417 * 0.16666667 + fVar254 * 0.6666667 + fVar445 * 0.16666667 + fVar381 * 0.0;
  fVar317 = fVar428 * 0.16666667 + fVar425 * 0.6666667 + fVar446 * 0.16666667 + fVar384 * 0.0;
  fVar260 = fVar433 * 0.16666667 + fVar256 * 0.6666667 + fVar429 * 0.16666667 + fVar397 * 0.0;
  fVar311 = fVar423 * 0.16666667 + fVar442 * 0.6666667 + fVar434 * 0.16666667 + fVar413 * 0.0;
  fVar435 = ((fVar254 * 0.0 + fVar445 * 0.5) - fVar417 * 0.5) - fVar381 * 0.0;
  fVar258 = ((fVar425 * 0.0 + fVar446 * 0.5) - fVar428 * 0.5) - fVar384 * 0.0;
  fVar192 = ((fVar256 * 0.0 + fVar429 * 0.5) - fVar433 * 0.5) - fVar397 * 0.0;
  fVar259 = ((fVar442 * 0.0 + fVar434 * 0.5) - fVar423 * 0.5) - fVar413 * 0.0;
  fVar417 = fVar241 * fVar418 - fVar424 * fVar213;
  fVar433 = fVar242 * fVar424 - fVar426 * fVar241;
  fVar423 = fVar213 * fVar426 - fVar418 * fVar242;
  fVar254 = fVar243 * fVar427 - fVar427 * fVar243;
  fVar348 = fVar241 * fVar407 - fVar414 * fVar213;
  fVar369 = fVar242 * fVar414 - fVar415 * fVar241;
  fVar370 = fVar213 * fVar415 - fVar407 * fVar242;
  fVar310 = fVar209 * fVar307 - fVar317 * fVar448;
  fVar314 = fVar210 * fVar317 - fVar260 * fVar209;
  fVar339 = fVar448 * fVar260 - fVar307 * fVar210;
  fVar340 = fVar211 * fVar311 - fVar311 * fVar211;
  fVar307 = fVar209 * fVar435 - fVar258 * fVar448;
  fVar317 = fVar210 * fVar258 - fVar192 * fVar209;
  fVar192 = fVar448 * fVar192 - fVar435 * fVar210;
  fVar384 = fVar423 * fVar423 + fVar433 * fVar433 + fVar417 * fVar417;
  auVar158 = ZEXT416((uint)fVar384);
  auVar294 = rsqrtss(ZEXT416((uint)fVar384),auVar158);
  fVar435 = auVar294._0_4_;
  fVar397 = fVar435 * 1.5 - fVar435 * fVar435 * fVar384 * 0.5 * fVar435;
  fVar428 = fVar417 * fVar348 + fVar423 * fVar370 + fVar433 * fVar369;
  fVar435 = fVar254 * fVar397;
  auVar294 = rcpss(auVar158,auVar158);
  fVar357 = (2.0 - fVar384 * auVar294._0_4_) * auVar294._0_4_;
  fVar381 = fVar339 * fVar339 + fVar314 * fVar314 + fVar310 * fVar310;
  auVar294 = ZEXT416((uint)fVar381);
  auVar158 = rsqrtss(ZEXT416((uint)fVar381),auVar294);
  fVar258 = auVar158._0_4_;
  fVar311 = fVar258 * 1.5 - fVar258 * fVar258 * fVar381 * 0.5 * fVar258;
  fVar413 = fVar310 * fVar307 + fVar339 * fVar192 + fVar314 * fVar317;
  fVar260 = fVar340 * fVar311;
  auVar294 = rcpss(auVar294,auVar294);
  fVar258 = (2.0 - fVar381 * auVar294._0_4_) * auVar294._0_4_;
  fVar349 = fVar447 * fVar433 * fVar397;
  fVar358 = fVar447 * fVar423 * fVar397;
  fVar359 = fVar447 * fVar417 * fVar397;
  fVar360 = fVar447 * fVar435;
  fVar389 = fVar436 - fVar349;
  fVar398 = fVar437 - fVar358;
  fVar401 = fVar438 - fVar359;
  fVar404 = fVar447 - fVar360;
  fVar371 = fVar447 * fVar357 * (fVar384 * fVar369 - fVar428 * fVar433) * fVar397 +
            fVar243 * fVar433 * fVar397;
  fVar382 = fVar447 * fVar357 * (fVar384 * fVar370 - fVar428 * fVar423) * fVar397 +
            fVar243 * fVar423 * fVar397;
  fVar385 = fVar447 * fVar357 * (fVar384 * fVar348 - fVar428 * fVar417) * fVar397 +
            fVar243 * fVar417 * fVar397;
  fVar387 = fVar447 * fVar357 * (fVar384 * (fVar243 * fVar416 - fVar416 * fVar243) -
                                fVar428 * fVar254) * fVar397 + fVar243 * fVar435;
  fVar349 = fVar349 + fVar436;
  fVar358 = fVar358 + fVar437;
  fVar359 = fVar359 + fVar438;
  fVar360 = fVar360 + fVar447;
  fVar436 = fVar257 * fVar314 * fVar311;
  fVar437 = fVar257 * fVar339 * fVar311;
  fVar438 = fVar257 * fVar310 * fVar311;
  fVar447 = fVar257 * fVar260;
  fVar418 = fVar244 - fVar436;
  fVar426 = fVar253 - fVar437;
  fVar312 = fVar255 - fVar438;
  fVar315 = fVar257 - fVar447;
  fVar407 = fVar257 * fVar258 * (fVar381 * fVar317 - fVar413 * fVar314) * fVar311 +
            fVar211 * fVar314 * fVar311;
  fVar414 = fVar257 * fVar258 * (fVar381 * fVar192 - fVar413 * fVar339) * fVar311 +
            fVar211 * fVar339 * fVar311;
  fVar415 = fVar257 * fVar258 * (fVar381 * fVar307 - fVar413 * fVar310) * fVar311 +
            fVar211 * fVar310 * fVar311;
  fVar416 = fVar257 * fVar258 * (fVar381 * (fVar211 * fVar259 - fVar259 * fVar211) -
                                fVar413 * fVar340) * fVar311 + fVar211 * fVar260;
  fVar436 = fVar436 + fVar244;
  fVar437 = fVar437 + fVar253;
  fVar438 = fVar438 + fVar255;
  fVar447 = fVar447 + fVar257;
  lVar24 = *(long *)(_Var22 + 0x38 + lVar134);
  lVar25 = *(long *)(_Var22 + 0x48 + lVar134);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar131);
  fVar435 = *pfVar3;
  fVar258 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar259 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar133);
  fVar307 = *pfVar3;
  fVar317 = pfVar3[1];
  fVar260 = pfVar3[2];
  fVar310 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar311 = *pfVar3;
  fVar314 = pfVar3[1];
  fVar339 = pfVar3[2];
  fVar340 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar348 = *pfVar3;
  fVar357 = pfVar3[1];
  fVar369 = pfVar3[2];
  fVar370 = pfVar3[3];
  lVar24 = *(long *)(lVar23 + 0x38 + lVar134);
  lVar23 = *(long *)(lVar23 + 0x48 + lVar134);
  uVar131 = uVar131 * lVar23;
  fVar390 = fVar435 * 0.16666667 + fVar307 * 0.6666667 + fVar311 * 0.16666667 + fVar348 * 0.0;
  fVar399 = fVar258 * 0.16666667 + fVar317 * 0.6666667 + fVar314 * 0.16666667 + fVar357 * 0.0;
  fVar402 = fVar192 * 0.16666667 + fVar260 * 0.6666667 + fVar339 * 0.16666667 + fVar369 * 0.0;
  fVar405 = fVar259 * 0.16666667 + fVar310 * 0.6666667 + fVar340 * 0.16666667 + fVar370 * 0.0;
  fVar244 = ((fVar311 * 0.5 + fVar348 * 0.0) - fVar307 * 0.0) - fVar435 * 0.5;
  fVar253 = ((fVar314 * 0.5 + fVar357 * 0.0) - fVar317 * 0.0) - fVar258 * 0.5;
  fVar255 = ((fVar339 * 0.5 + fVar369 * 0.0) - fVar260 * 0.0) - fVar192 * 0.5;
  fVar257 = ((fVar340 * 0.5 + fVar370 * 0.0) - fVar310 * 0.0) - fVar259 * 0.5;
  pfVar3 = (float *)(lVar24 + lVar23 * lVar2);
  fVar381 = *pfVar3;
  fVar384 = pfVar3[1];
  fVar397 = pfVar3[2];
  fVar413 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar1 * lVar23);
  fVar417 = *pfVar3;
  fVar428 = pfVar3[1];
  fVar433 = pfVar3[2];
  fVar423 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar133 * lVar23);
  fVar254 = *pfVar3;
  fVar425 = pfVar3[1];
  fVar256 = pfVar3[2];
  fVar442 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + uVar131);
  fVar445 = *pfVar3;
  fVar446 = pfVar3[1];
  fVar429 = pfVar3[2];
  fVar434 = pfVar3[3];
  fVar391 = fVar445 * 0.16666667 + fVar254 * 0.6666667 + fVar417 * 0.16666667 + fVar381 * 0.0;
  fVar400 = fVar446 * 0.16666667 + fVar425 * 0.6666667 + fVar428 * 0.16666667 + fVar384 * 0.0;
  fVar403 = fVar429 * 0.16666667 + fVar256 * 0.6666667 + fVar433 * 0.16666667 + fVar397 * 0.0;
  fVar406 = fVar434 * 0.16666667 + fVar442 * 0.6666667 + fVar423 * 0.16666667 + fVar413 * 0.0;
  fVar372 = ((fVar417 * 0.5 + fVar381 * 0.0) - fVar254 * 0.0) - fVar445 * 0.5;
  fVar383 = ((fVar428 * 0.5 + fVar384 * 0.0) - fVar425 * 0.0) - fVar446 * 0.5;
  fVar386 = ((fVar433 * 0.5 + fVar397 * 0.0) - fVar256 * 0.0) - fVar429 * 0.5;
  fVar388 = ((fVar423 * 0.5 + fVar413 * 0.0) - fVar442 * 0.0) - fVar434 * 0.5;
  fVar424 = fVar307 * 0.16666667 + fVar311 * 0.6666667 + fVar348 * 0.16666667 + fVar435 * 0.0;
  fVar427 = fVar317 * 0.16666667 + fVar314 * 0.6666667 + fVar357 * 0.16666667 + fVar258 * 0.0;
  fVar313 = fVar260 * 0.16666667 + fVar339 * 0.6666667 + fVar369 * 0.16666667 + fVar192 * 0.0;
  fVar316 = fVar310 * 0.16666667 + fVar340 * 0.6666667 + fVar370 * 0.16666667 + fVar259 * 0.0;
  fVar435 = ((fVar311 * 0.0 + fVar348 * 0.5) - fVar307 * 0.5) - fVar435 * 0.0;
  fVar258 = ((fVar314 * 0.0 + fVar357 * 0.5) - fVar317 * 0.5) - fVar258 * 0.0;
  fVar192 = ((fVar339 * 0.0 + fVar369 * 0.5) - fVar260 * 0.5) - fVar192 * 0.0;
  fVar259 = ((fVar340 * 0.0 + fVar370 * 0.5) - fVar310 * 0.5) - fVar259 * 0.0;
  fVar311 = fVar254 * 0.16666667 + fVar417 * 0.6666667 + fVar381 * 0.16666667 + fVar445 * 0.0;
  fVar314 = fVar425 * 0.16666667 + fVar428 * 0.6666667 + fVar384 * 0.16666667 + fVar446 * 0.0;
  fVar339 = fVar256 * 0.16666667 + fVar433 * 0.6666667 + fVar397 * 0.16666667 + fVar429 * 0.0;
  fVar370 = fVar442 * 0.16666667 + fVar423 * 0.6666667 + fVar413 * 0.16666667 + fVar434 * 0.0;
  fVar307 = ((fVar417 * 0.0 + fVar381 * 0.5) - fVar254 * 0.5) - fVar445 * 0.0;
  fVar317 = ((fVar428 * 0.0 + fVar384 * 0.5) - fVar425 * 0.5) - fVar446 * 0.0;
  fVar260 = ((fVar433 * 0.0 + fVar397 * 0.5) - fVar256 * 0.5) - fVar429 * 0.0;
  fVar340 = ((fVar423 * 0.0 + fVar413 * 0.5) - fVar442 * 0.5) - fVar434 * 0.0;
  fVar369 = fVar253 * fVar391 - fVar400 * fVar244;
  fVar428 = fVar255 * fVar400 - fVar403 * fVar253;
  fVar423 = fVar244 * fVar403 - fVar391 * fVar255;
  fVar425 = fVar257 * fVar406 - fVar406 * fVar257;
  fVar310 = fVar253 * fVar372 - fVar383 * fVar244;
  fVar348 = fVar255 * fVar383 - fVar386 * fVar253;
  fVar357 = fVar244 * fVar386 - fVar372 * fVar255;
  fVar417 = fVar258 * fVar311 - fVar314 * fVar435;
  fVar433 = fVar192 * fVar314 - fVar339 * fVar258;
  fVar254 = fVar435 * fVar339 - fVar311 * fVar192;
  fVar256 = fVar259 * fVar370 - fVar370 * fVar259;
  fVar311 = fVar258 * fVar307 - fVar317 * fVar435;
  fVar314 = fVar192 * fVar317 - fVar260 * fVar258;
  fVar339 = fVar435 * fVar260 - fVar307 * fVar192;
  fVar307 = fVar423 * fVar423 + fVar428 * fVar428 + fVar369 * fVar369;
  auVar294 = ZEXT416((uint)fVar307);
  auVar158 = rsqrtss(ZEXT416((uint)fVar307),auVar294);
  fVar317 = auVar158._0_4_;
  fVar370 = fVar317 * 1.5 - fVar317 * fVar317 * fVar307 * 0.5 * fVar317;
  fVar442 = fVar369 * fVar310 + fVar423 * fVar357 + fVar428 * fVar348;
  auVar294 = rcpss(auVar294,auVar294);
  fVar317 = (2.0 - fVar307 * auVar294._0_4_) * auVar294._0_4_;
  fVar260 = fVar425 * fVar370;
  fVar446 = fVar254 * fVar254 + fVar433 * fVar433 + fVar417 * fVar417;
  auVar294 = ZEXT416((uint)fVar446);
  auVar158 = rsqrtss(ZEXT416((uint)fVar446),auVar294);
  fVar381 = auVar158._0_4_;
  fVar434 = fVar381 * 1.5 - fVar381 * fVar381 * fVar446 * 0.5 * fVar381;
  fVar372 = fVar417 * fVar311 + fVar254 * fVar339 + fVar433 * fVar314;
  auVar294 = rcpss(auVar294,auVar294);
  fVar383 = (2.0 - fVar446 * auVar294._0_4_) * auVar294._0_4_;
  fVar429 = fVar256 * fVar434;
  fVar381 = fVar405 * fVar428 * fVar370;
  fVar384 = fVar405 * fVar423 * fVar370;
  fVar397 = fVar405 * fVar369 * fVar370;
  fVar413 = fVar405 * fVar260;
  fVar348 = fVar405 * fVar317 * (fVar307 * fVar348 - fVar442 * fVar428) * fVar370 +
            fVar257 * fVar428 * fVar370;
  fVar357 = fVar405 * fVar317 * (fVar307 * fVar357 - fVar442 * fVar423) * fVar370 +
            fVar257 * fVar423 * fVar370;
  fVar369 = fVar405 * fVar317 * (fVar307 * fVar310 - fVar442 * fVar369) * fVar370 +
            fVar257 * fVar369 * fVar370;
  fVar370 = fVar405 * fVar317 * (fVar307 * (fVar257 * fVar388 - fVar388 * fVar257) -
                                fVar442 * fVar425) * fVar370 + fVar257 * fVar260;
  fVar428 = fVar390 - fVar381;
  fVar423 = fVar399 - fVar384;
  fVar425 = fVar402 - fVar397;
  fVar442 = fVar405 - fVar413;
  fVar381 = fVar381 + fVar390;
  fVar384 = fVar384 + fVar399;
  fVar397 = fVar397 + fVar402;
  fVar413 = fVar413 + fVar405;
  fVar307 = fVar316 * fVar433 * fVar434;
  fVar317 = fVar316 * fVar254 * fVar434;
  fVar260 = fVar316 * fVar417 * fVar434;
  fVar310 = fVar316 * fVar429;
  fVar433 = fVar316 * fVar383 * (fVar446 * fVar314 - fVar372 * fVar433) * fVar434 +
            fVar259 * fVar433 * fVar434;
  fVar254 = fVar316 * fVar383 * (fVar446 * fVar339 - fVar372 * fVar254) * fVar434 +
            fVar259 * fVar254 * fVar434;
  fVar445 = fVar316 * fVar383 * (fVar446 * fVar311 - fVar372 * fVar417) * fVar434 +
            fVar259 * fVar417 * fVar434;
  fVar256 = fVar316 * fVar383 * (fVar446 * (fVar259 * fVar340 - fVar340 * fVar259) -
                                fVar372 * fVar256) * fVar434 + fVar259 * fVar429;
  fVar311 = fVar424 - fVar307;
  fVar314 = fVar427 - fVar317;
  fVar339 = fVar313 - fVar260;
  fVar340 = fVar316 - fVar310;
  fVar307 = fVar307 + fVar424;
  fVar317 = fVar317 + fVar427;
  fVar260 = fVar260 + fVar313;
  fVar310 = fVar310 + fVar316;
  fVar417 = 1.0 - fVar305;
  local_398 = fVar389 * fVar417 + fVar428 * fVar305;
  fStack_394 = fVar398 * fVar417 + fVar423 * fVar305;
  fStack_390 = fVar401 * fVar417 + fVar425 * fVar305;
  fStack_38c = fVar404 * fVar417 + fVar442 * fVar305;
  local_3a8 = ((fVar213 - fVar371) * 0.33333334 + fVar389) * fVar417 +
              ((fVar244 - fVar348) * 0.33333334 + fVar428) * fVar305;
  fStack_3a4 = ((fVar241 - fVar382) * 0.33333334 + fVar398) * fVar417 +
               ((fVar253 - fVar357) * 0.33333334 + fVar423) * fVar305;
  fStack_3a0 = ((fVar242 - fVar385) * 0.33333334 + fVar401) * fVar417 +
               ((fVar255 - fVar369) * 0.33333334 + fVar425) * fVar305;
  fStack_39c = ((fVar243 - fVar387) * 0.33333334 + fVar404) * fVar417 +
               ((fVar257 - fVar370) * 0.33333334 + fVar442) * fVar305;
  local_3c8 = (fVar418 - (fVar448 - fVar407) * 0.33333334) * fVar417 +
              (fVar311 - (fVar435 - fVar433) * 0.33333334) * fVar305;
  fStack_3c4 = (fVar426 - (fVar209 - fVar414) * 0.33333334) * fVar417 +
               (fVar314 - (fVar258 - fVar254) * 0.33333334) * fVar305;
  fStack_3c0 = (fVar312 - (fVar210 - fVar415) * 0.33333334) * fVar417 +
               (fVar339 - (fVar192 - fVar445) * 0.33333334) * fVar305;
  fStack_3bc = (fVar315 - (fVar211 - fVar416) * 0.33333334) * fVar417 +
               (fVar340 - (fVar259 - fVar256) * 0.33333334) * fVar305;
  local_3b8 = fVar418 * fVar417 + fVar311 * fVar305;
  fStack_3b4 = fVar426 * fVar417 + fVar314 * fVar305;
  fStack_3b0 = fVar312 * fVar417 + fVar339 * fVar305;
  fStack_3ac = fVar315 * fVar417 + fVar340 * fVar305;
  local_388 = fVar349 * fVar417 + fVar381 * fVar305;
  fStack_384 = fVar358 * fVar417 + fVar384 * fVar305;
  fStack_380 = fVar359 * fVar417 + fVar397 * fVar305;
  fStack_37c = fVar360 * fVar417 + fVar413 * fVar305;
  local_378 = ((fVar371 + fVar213) * 0.33333334 + fVar349) * fVar417 +
              ((fVar348 + fVar244) * 0.33333334 + fVar381) * fVar305;
  fStack_374 = ((fVar382 + fVar241) * 0.33333334 + fVar358) * fVar417 +
               ((fVar357 + fVar253) * 0.33333334 + fVar384) * fVar305;
  fStack_370 = ((fVar385 + fVar242) * 0.33333334 + fVar359) * fVar417 +
               ((fVar369 + fVar255) * 0.33333334 + fVar397) * fVar305;
  fStack_36c = ((fVar387 + fVar243) * 0.33333334 + fVar360) * fVar417 +
               ((fVar370 + fVar257) * 0.33333334 + fVar413) * fVar305;
  local_3dc.m128[1] =
       (fVar436 - (fVar407 + fVar448) * 0.33333334) * fVar417 +
       (fVar307 - (fVar433 + fVar435) * 0.33333334) * fVar305;
  local_3dc.m128[2] =
       (fVar437 - (fVar414 + fVar209) * 0.33333334) * fVar417 +
       (fVar317 - (fVar254 + fVar258) * 0.33333334) * fVar305;
  local_3dc.m128[3] =
       (fVar438 - (fVar415 + fVar210) * 0.33333334) * fVar417 +
       (fVar260 - (fVar445 + fVar192) * 0.33333334) * fVar305;
  fStack_3cc = (fVar447 - (fVar416 + fVar211) * 0.33333334) * fVar417 +
               (fVar310 - (fVar256 + fVar259) * 0.33333334) * fVar305;
  local_218 = fVar417 * fVar436 + fVar305 * fVar307;
  fStack_214 = fVar417 * fVar437 + fVar305 * fVar317;
  fStack_210 = fVar417 * fVar438 + fVar305 * fVar260;
  fStack_20c = fVar417 * fVar447 + fVar305 * fVar310;
  fVar435 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar258 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar305 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar192 = (pre->ray_space).vx.field_0.m128[0];
  fVar259 = (pre->ray_space).vx.field_0.m128[1];
  fVar307 = (pre->ray_space).vy.field_0.m128[0];
  fVar317 = (pre->ray_space).vy.field_0.m128[1];
  fVar260 = (pre->ray_space).vz.field_0.m128[0];
  fVar310 = (pre->ray_space).vz.field_0.m128[1];
  fVar369 = (local_398 - fVar435) * fVar192 +
            (fStack_394 - fVar258) * fVar307 + (fStack_390 - fVar305) * fVar260;
  fVar370 = (local_398 - fVar435) * fVar259 +
            (fStack_394 - fVar258) * fVar317 + (fStack_390 - fVar305) * fVar310;
  local_2b8._0_8_ = CONCAT44(fVar370,fVar369);
  fVar348 = (local_3a8 - fVar435) * fVar192 +
            (fStack_3a4 - fVar258) * fVar307 + (fStack_3a0 - fVar305) * fVar260;
  fVar357 = (local_3a8 - fVar435) * fVar259 +
            (fStack_3a4 - fVar258) * fVar317 + (fStack_3a0 - fVar305) * fVar310;
  local_2c8._0_8_ = CONCAT44(fVar357,fVar348);
  fVar311 = (local_3c8 - fVar435) * fVar192 +
            (fStack_3c4 - fVar258) * fVar307 + (fStack_3c0 - fVar305) * fVar260;
  fVar314 = (local_3c8 - fVar435) * fVar259 +
            (fStack_3c4 - fVar258) * fVar317 + (fStack_3c0 - fVar305) * fVar310;
  local_338 = CONCAT44(fVar314,fVar311);
  fVar339 = (local_3b8 - fVar435) * fVar192 +
            (fStack_3b4 - fVar258) * fVar307 + (fStack_3b0 - fVar305) * fVar260;
  fVar340 = (local_3b8 - fVar435) * fVar259 +
            (fStack_3b4 - fVar258) * fVar317 + (fStack_3b0 - fVar305) * fVar310;
  local_2d8 = CONCAT44(fVar340,fVar339);
  fStack_348 = (local_388 - fVar435) * fVar192 +
               (fStack_384 - fVar258) * fVar307 + (fStack_380 - fVar305) * fVar260;
  fStack_344 = (local_388 - fVar435) * fVar259 +
               (fStack_384 - fVar258) * fVar317 + (fStack_380 - fVar305) * fVar310;
  fVar381 = (local_378 - fVar435) * fVar192 +
            (fStack_374 - fVar258) * fVar307 + (fStack_370 - fVar305) * fVar260;
  fVar384 = (local_378 - fVar435) * fVar259 +
            (fStack_374 - fVar258) * fVar317 + (fStack_370 - fVar305) * fVar310;
  uVar245 = CONCAT44(fVar384,fVar381);
  fStack_298 = (local_3dc.m128[1] - fVar435) * fVar192 +
               (local_3dc.m128[2] - fVar258) * fVar307 + (local_3dc.m128[3] - fVar305) * fVar260;
  fStack_294 = (local_3dc.m128[1] - fVar435) * fVar259 +
               (local_3dc.m128[2] - fVar258) * fVar317 + (local_3dc.m128[3] - fVar305) * fVar310;
  fVar192 = (local_218 - fVar435) * fVar192 +
            (fStack_214 - fVar258) * fVar307 + (fStack_210 - fVar305) * fVar260;
  fVar435 = (local_218 - fVar435) * fVar259 +
            (fStack_214 - fVar258) * fVar317 + (fStack_210 - fVar305) * fVar310;
  local_318 = CONCAT44(fVar435,fVar192);
  _fStack_360 = uVar245;
  _local_368 = local_2c8._0_8_;
  local_b8._8_8_ = local_318;
  local_b8._0_8_ = local_2d8;
  auVar170._8_4_ = fStack_348;
  auVar170._0_8_ = local_2b8._0_8_;
  auVar170._12_4_ = fStack_344;
  auVar294 = minps(auVar170,_local_368);
  auVar196._8_4_ = fStack_298;
  auVar196._0_8_ = local_338;
  auVar196._12_4_ = fStack_294;
  auVar158 = minps(auVar196,local_b8);
  auVar294 = minps(auVar294,auVar158);
  auVar197._4_4_ = fVar370;
  auVar197._0_4_ = fVar369;
  auVar197._8_4_ = fStack_348;
  auVar197._12_4_ = fStack_344;
  auVar158 = maxps(auVar197,_local_368);
  auVar231._4_4_ = fVar314;
  auVar231._0_4_ = fVar311;
  auVar231._8_4_ = fStack_298;
  auVar231._12_4_ = fStack_294;
  auVar232 = maxps(auVar231,local_b8);
  auVar230 = maxps(auVar158,auVar232);
  auVar29._4_8_ = auVar232._8_8_;
  auVar29._0_4_ = auVar294._4_4_;
  auVar233._0_8_ = auVar29._0_8_ << 0x20;
  auVar233._8_4_ = auVar294._8_4_;
  auVar233._12_4_ = auVar294._12_4_;
  auVar234._8_8_ = auVar294._8_8_;
  auVar234._0_8_ = auVar233._8_8_;
  auVar158 = minps(auVar294,auVar234);
  auVar30._4_8_ = auVar294._8_8_;
  auVar30._0_4_ = auVar230._4_4_;
  auVar235._0_8_ = auVar30._0_8_ << 0x20;
  auVar235._8_4_ = auVar230._8_4_;
  auVar235._12_4_ = auVar230._12_4_;
  auVar236._8_8_ = auVar230._8_8_;
  auVar236._0_8_ = auVar235._8_8_;
  auVar294 = maxps(auVar230,auVar236);
  auVar171._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
  auVar171._8_4_ = auVar158._8_4_ & 0x7fffffff;
  auVar171._12_4_ = auVar158._12_4_ & 0x7fffffff;
  auVar198._0_8_ = auVar294._0_8_ & 0x7fffffff7fffffff;
  auVar198._8_4_ = auVar294._8_4_ & 0x7fffffff;
  auVar198._12_4_ = auVar294._12_4_ & 0x7fffffff;
  auVar294 = maxps(auVar171,auVar198);
  fStack_c4 = auVar294._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar294._0_4_) {
    local_c8 = auVar294._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_2b8._8_8_ = local_2b8._0_8_;
  local_2c8._8_8_ = local_2c8._0_8_;
  uStack_330 = local_338;
  register0x00001388 = local_2d8;
  register0x00001288 = uVar245;
  local_2f8 = uVar245;
  register0x00001348 = local_318;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  local_358 = local_2b8._0_8_;
  local_88 = fVar348 - fVar369;
  fStack_84 = fVar357 - fVar370;
  fStack_80 = fVar381 - fStack_348;
  fStack_7c = fVar384 - fStack_344;
  local_98 = fVar311 - fVar348;
  fStack_94 = fVar314 - fVar357;
  fStack_90 = fStack_298 - fVar381;
  fStack_8c = fStack_294 - fVar384;
  local_2a8 = local_338;
  local_a8 = fVar339 - fVar311;
  fStack_a4 = fVar340 - fVar314;
  fStack_a0 = fVar192 - fStack_298;
  fStack_9c = fVar435 - fStack_294;
  local_188 = local_388 - local_398;
  fStack_184 = fStack_384 - fStack_394;
  fStack_180 = fStack_380 - fStack_390;
  fStack_17c = fStack_37c - fStack_38c;
  local_198 = local_378 - local_3a8;
  fStack_194 = fStack_374 - fStack_3a4;
  fStack_190 = fStack_370 - fStack_3a0;
  fStack_18c = fStack_36c - fStack_39c;
  local_1a8 = local_3dc.m128[1] - local_3c8;
  fStack_1a4 = local_3dc.m128[2] - fStack_3c4;
  fStack_1a0 = local_3dc.m128[3] - fStack_3c0;
  fStack_19c = fStack_3cc - fStack_3bc;
  local_1b8 = local_218 - local_3b8;
  fStack_1b4 = fStack_214 - fStack_3b4;
  fStack_1b0 = fStack_210 - fStack_3b0;
  fStack_1ac = fStack_20c - fStack_3ac;
  uVar135 = 0;
  local_418._0_4_ = 0.0;
  local_418._4_4_ = 1.0;
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  fVar305 = 0.0;
  fVar192 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  local_2e8 = fStack_348;
  fStack_2e4 = fStack_344;
  fStack_2e0 = fStack_348;
  fStack_2dc = fStack_344;
  local_308 = fStack_298;
  fStack_304 = fStack_294;
  fStack_300 = fStack_298;
  fStack_2fc = fStack_294;
  fVar435 = fVar311;
  fVar258 = fVar314;
LAB_0038c19b:
  fVar259 = 1.0 - (float)local_418._0_4_;
  fVar307 = 1.0 - (float)local_418._0_4_;
  fVar317 = 1.0 - (float)local_418._4_4_;
  fVar260 = 1.0 - (float)local_418._4_4_;
  fVar381 = local_2b8._0_4_ * fVar259 + local_2e8 * (float)local_418._0_4_;
  fVar433 = local_2b8._4_4_ * fVar307 + fStack_2e4 * (float)local_418._0_4_;
  fVar423 = local_2b8._8_4_ * fVar317 + fStack_2e0 * (float)local_418._4_4_;
  fVar256 = local_2b8._12_4_ * fVar260 + fStack_2dc * (float)local_418._4_4_;
  fVar310 = local_2c8._0_4_ * fVar259 + local_2f8._0_4_ * (float)local_418._0_4_;
  fVar413 = local_2c8._4_4_ * fVar307 + local_2f8._4_4_ * (float)local_418._0_4_;
  fVar417 = local_2c8._8_4_ * fVar317 + local_2f8._8_4_ * (float)local_418._4_4_;
  fVar428 = local_2c8._12_4_ * fVar260 + local_2f8._12_4_ * (float)local_418._4_4_;
  fVar437 = fVar311 * fVar259 + local_308 * (float)local_418._0_4_;
  fVar438 = fVar314 * fVar307 + fStack_304 * (float)local_418._0_4_;
  fVar447 = fVar435 * fVar317 + fStack_300 * (float)local_418._4_4_;
  fVar448 = fVar258 * fVar260 + fStack_2fc * (float)local_418._4_4_;
  fVar254 = fVar259 * local_2d8._0_4_ + (float)local_418._0_4_ * local_318._0_4_;
  fVar425 = fVar307 * local_2d8._4_4_ + (float)local_418._0_4_ * local_318._4_4_;
  fVar442 = fVar317 * local_2d8._8_4_ + (float)local_418._4_4_ * local_318._8_4_;
  fVar445 = fVar260 * local_2d8._12_4_ + (float)local_418._4_4_ * local_318._12_4_;
  fVar446 = (fVar192 - fVar305) * 0.11111111;
  local_428 = CONCAT44(fVar192,fVar305);
  fVar429 = (fVar192 - fVar305) * 0.0 + fVar305;
  fVar434 = (fVar192 - fVar305) * 0.33333334 + fVar305;
  fVar436 = (fVar192 - fVar305) * 0.6666667 + fVar305;
  fVar305 = (fVar192 - fVar305) * 1.0 + fVar305;
  fVar435 = 1.0 - fVar429;
  fVar258 = 1.0 - fVar434;
  fVar192 = 1.0 - fVar436;
  fVar260 = 1.0 - fVar305;
  fVar311 = fVar310 * fVar435 + fVar437 * fVar429;
  fVar314 = fVar310 * fVar258 + fVar437 * fVar434;
  fVar339 = fVar310 * fVar192 + fVar437 * fVar436;
  fVar340 = fVar310 * fVar260 + fVar437 * fVar305;
  fVar348 = fVar413 * fVar435 + fVar438 * fVar429;
  fVar357 = fVar413 * fVar258 + fVar438 * fVar434;
  fVar369 = fVar413 * fVar192 + fVar438 * fVar436;
  fVar370 = fVar413 * fVar260 + fVar438 * fVar305;
  fVar259 = (fVar381 * fVar435 + fVar310 * fVar429) * fVar435 + fVar429 * fVar311;
  fVar307 = (fVar381 * fVar258 + fVar310 * fVar434) * fVar258 + fVar434 * fVar314;
  fVar317 = (fVar381 * fVar192 + fVar310 * fVar436) * fVar192 + fVar436 * fVar339;
  fVar310 = (fVar381 * fVar260 + fVar310 * fVar305) * fVar260 + fVar305 * fVar340;
  fVar381 = (fVar433 * fVar435 + fVar413 * fVar429) * fVar435 + fVar429 * fVar348;
  fVar384 = (fVar433 * fVar258 + fVar413 * fVar434) * fVar258 + fVar434 * fVar357;
  fVar397 = (fVar433 * fVar192 + fVar413 * fVar436) * fVar192 + fVar436 * fVar369;
  fVar413 = (fVar433 * fVar260 + fVar413 * fVar305) * fVar260 + fVar305 * fVar370;
  fVar311 = fVar311 * fVar435 + (fVar437 * fVar435 + fVar254 * fVar429) * fVar429;
  fVar314 = fVar314 * fVar258 + (fVar437 * fVar258 + fVar254 * fVar434) * fVar434;
  fVar339 = fVar339 * fVar192 + (fVar437 * fVar192 + fVar254 * fVar436) * fVar436;
  fVar340 = fVar340 * fVar260 + (fVar437 * fVar260 + fVar254 * fVar305) * fVar305;
  fVar348 = fVar348 * fVar435 + (fVar438 * fVar435 + fVar425 * fVar429) * fVar429;
  fVar357 = fVar357 * fVar258 + (fVar438 * fVar258 + fVar425 * fVar434) * fVar434;
  fVar369 = fVar369 * fVar192 + (fVar438 * fVar192 + fVar425 * fVar436) * fVar436;
  fVar370 = fVar370 * fVar260 + (fVar438 * fVar260 + fVar425 * fVar305) * fVar305;
  local_258 = fVar435 * fVar259 + fVar429 * fVar311;
  fStack_254 = fVar258 * fVar307 + fVar434 * fVar314;
  fStack_250 = fVar192 * fVar317 + fVar436 * fVar339;
  fStack_24c = fVar260 * fVar310 + fVar305 * fVar340;
  local_148 = fVar435 * fVar381 + fVar429 * fVar348;
  fStack_144 = fVar258 * fVar384 + fVar434 * fVar357;
  fStack_140 = fVar192 * fVar397 + fVar436 * fVar369;
  fStack_13c = fVar260 * fVar413 + fVar305 * fVar370;
  fVar307 = (fVar314 - fVar307) * 3.0 * fVar446;
  fVar317 = (fVar339 - fVar317) * 3.0 * fVar446;
  fVar310 = (fVar340 - fVar310) * 3.0 * fVar446;
  fVar314 = (fVar357 - fVar384) * 3.0 * fVar446;
  fVar339 = (fVar369 - fVar397) * 3.0 * fVar446;
  fVar340 = (fVar370 - fVar413) * 3.0 * fVar446;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar311 - fVar259) * 3.0 * fVar446;
  fStack_234 = fStack_254 + fVar307;
  fStack_230 = fStack_250 + fVar317;
  fStack_22c = fStack_24c + fVar310;
  local_328._0_4_ = local_148 + (fVar348 - fVar381) * 3.0 * fVar446;
  local_328._4_4_ = fStack_144 + fVar314;
  fStack_320 = fStack_140 + fVar339;
  fStack_31c = fStack_13c + fVar340;
  local_248._0_4_ = fStack_254 - fVar307;
  local_248._4_4_ = fStack_250 - fVar317;
  local_248._8_4_ = fStack_24c - fVar310;
  local_248._12_4_ = 0;
  auVar172._0_4_ = fStack_144 - fVar314;
  auVar172._4_4_ = fStack_140 - fVar339;
  auVar172._8_4_ = fStack_13c - fVar340;
  auVar172._12_4_ = 0;
  fVar259 = fVar417 * fVar435 + fVar447 * fVar429;
  fVar307 = fVar417 * fVar258 + fVar447 * fVar434;
  fVar317 = fVar417 * fVar192 + fVar447 * fVar436;
  fVar310 = fVar417 * fVar260 + fVar447 * fVar305;
  fVar311 = fVar428 * fVar435 + fVar448 * fVar429;
  fVar314 = fVar428 * fVar258 + fVar448 * fVar434;
  fVar339 = fVar428 * fVar192 + fVar448 * fVar436;
  fVar433 = fVar428 * fVar260 + fVar448 * fVar305;
  fVar340 = (fVar423 * fVar435 + fVar417 * fVar429) * fVar435 + fVar429 * fVar259;
  fVar348 = (fVar423 * fVar258 + fVar417 * fVar434) * fVar258 + fVar434 * fVar307;
  fVar357 = (fVar423 * fVar192 + fVar417 * fVar436) * fVar192 + fVar436 * fVar317;
  fVar369 = (fVar423 * fVar260 + fVar417 * fVar305) * fVar260 + fVar305 * fVar310;
  fVar423 = (fVar256 * fVar435 + fVar428 * fVar429) * fVar435 + fVar429 * fVar311;
  fVar254 = (fVar256 * fVar258 + fVar428 * fVar434) * fVar258 + fVar434 * fVar314;
  fVar425 = (fVar256 * fVar192 + fVar428 * fVar436) * fVar192 + fVar436 * fVar339;
  fVar256 = (fVar256 * fVar260 + fVar428 * fVar305) * fVar260 + fVar305 * fVar433;
  fVar370 = fVar259 * fVar435 + (fVar447 * fVar435 + fVar442 * fVar429) * fVar429;
  fVar381 = fVar307 * fVar258 + (fVar447 * fVar258 + fVar442 * fVar434) * fVar434;
  fVar384 = fVar317 * fVar192 + (fVar447 * fVar192 + fVar442 * fVar436) * fVar436;
  fVar397 = fVar310 * fVar260 + (fVar447 * fVar260 + fVar442 * fVar305) * fVar305;
  fVar413 = fVar311 * fVar435 + (fVar448 * fVar435 + fVar445 * fVar429) * fVar429;
  fVar417 = fVar314 * fVar258 + (fVar448 * fVar258 + fVar445 * fVar434) * fVar434;
  fVar428 = fVar339 * fVar192 + (fVar448 * fVar192 + fVar445 * fVar436) * fVar436;
  fVar433 = fVar433 * fVar260 + (fVar448 * fVar260 + fVar445 * fVar305) * fVar305;
  fVar310 = fVar435 * fVar340 + fVar429 * fVar370;
  fVar311 = fVar258 * fVar348 + fVar434 * fVar381;
  fVar314 = fVar192 * fVar357 + fVar436 * fVar384;
  fVar339 = fVar260 * fVar369 + fVar305 * fVar397;
  fVar259 = fVar435 * fVar423 + fVar429 * fVar413;
  fVar307 = fVar258 * fVar254 + fVar434 * fVar417;
  fVar317 = fVar192 * fVar425 + fVar436 * fVar428;
  fVar260 = fVar260 * fVar256 + fVar305 * fVar433;
  fVar435 = (fVar381 - fVar348) * 3.0 * fVar446;
  fVar258 = (fVar384 - fVar357) * 3.0 * fVar446;
  fVar305 = (fVar397 - fVar369) * 3.0 * fVar446;
  fVar192 = (fVar417 - fVar254) * 3.0 * fVar446;
  fVar348 = (fVar428 - fVar425) * 3.0 * fVar446;
  fVar357 = (fVar433 - fVar256) * 3.0 * fVar446;
  local_f8._4_4_ = fVar314;
  local_f8._0_4_ = fVar311;
  local_f8._8_4_ = fVar339;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar317;
  local_118._0_4_ = fVar307;
  local_118._8_4_ = fVar260;
  local_118._12_4_ = 0;
  local_138 = fVar310 + (fVar370 - fVar340) * 3.0 * fVar446;
  fStack_134 = fVar311 + fVar435;
  fStack_130 = fVar314 + fVar258;
  fStack_12c = fVar339 + fVar305;
  local_108 = fVar259 + (fVar413 - fVar423) * 3.0 * fVar446;
  fStack_104 = fVar307 + fVar192;
  fStack_100 = fVar317 + fVar348;
  fStack_fc = fVar260 + fVar357;
  local_d8._0_4_ = fVar311 - fVar435;
  local_d8._4_4_ = fVar314 - fVar258;
  local_d8._8_4_ = fVar339 - fVar305;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar307 - fVar192;
  local_128._4_4_ = fVar317 - fVar348;
  local_128._8_4_ = fVar260 - fVar357;
  local_128._12_4_ = 0;
  fVar435 = (fVar311 - fStack_254) + (fVar310 - local_258);
  fVar258 = (fVar314 - fStack_250) + (fVar311 - fStack_254);
  fVar305 = (fVar339 - fStack_24c) + (fVar314 - fStack_250);
  fVar192 = (fVar339 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar340 = (fVar307 - fStack_144) + (fVar259 - local_148);
  fVar348 = (fVar317 - fStack_140) + (fVar307 - fStack_144);
  fVar357 = (fVar260 - fStack_13c) + (fVar317 - fStack_140);
  fVar369 = (fVar260 - fStack_13c) + 0.0;
  auVar350._0_8_ =
       CONCAT44(fStack_144 * fVar258 - fStack_254 * fVar348,
                local_148 * fVar435 - local_258 * fVar340);
  auVar350._8_4_ = fStack_140 * fVar305 - fStack_250 * fVar357;
  auVar350._12_4_ = fStack_13c * fVar192 - fStack_24c * fVar369;
  auVar295._0_4_ = (float)local_328._0_4_ * fVar435 - local_238 * fVar340;
  auVar295._4_4_ = (float)local_328._4_4_ * fVar258 - fStack_234 * fVar348;
  auVar295._8_4_ = fStack_320 * fVar305 - fStack_230 * fVar357;
  auVar295._12_4_ = fStack_31c * fVar192 - fStack_22c * fVar369;
  auVar330._0_8_ =
       CONCAT44(auVar172._4_4_ * fVar258 - fVar348 * local_248._4_4_,
                auVar172._0_4_ * fVar435 - fVar340 * local_248._0_4_);
  auVar330._8_4_ = auVar172._8_4_ * fVar305 - fVar357 * local_248._8_4_;
  auVar330._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
  auVar420._0_4_ = fVar435 * fStack_144 - fVar340 * fStack_254;
  auVar420._4_4_ = fVar258 * fStack_140 - fVar348 * fStack_250;
  auVar420._8_4_ = fVar305 * fStack_13c - fVar357 * fStack_24c;
  auVar420._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
  auVar374._0_8_ =
       CONCAT44(fVar307 * fVar258 - fVar311 * fVar348,fVar259 * fVar435 - fVar310 * fVar340);
  auVar374._8_4_ = fVar317 * fVar305 - fVar314 * fVar357;
  auVar374._12_4_ = fVar260 * fVar192 - fVar339 * fVar369;
  auVar431._0_4_ = local_108 * fVar435 - local_138 * fVar340;
  auVar431._4_4_ = fStack_104 * fVar258 - fStack_134 * fVar348;
  auVar431._8_4_ = fStack_100 * fVar305 - fStack_130 * fVar357;
  auVar431._12_4_ = fStack_fc * fVar192 - fStack_12c * fVar369;
  auVar361._0_8_ =
       CONCAT44(local_128._4_4_ * fVar258 - fVar348 * local_d8._4_4_,
                local_128._0_4_ * fVar435 - fVar340 * local_d8._0_4_);
  auVar361._8_4_ = local_128._8_4_ * fVar305 - fVar357 * local_d8._8_4_;
  auVar361._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
  auVar175._0_4_ = fVar435 * fVar307 - fVar340 * fVar311;
  auVar175._4_4_ = fVar258 * fVar317 - fVar348 * fVar314;
  auVar175._8_4_ = fVar305 * fVar260 - fVar357 * fVar339;
  auVar175._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
  auVar199._8_4_ = auVar350._8_4_;
  auVar199._0_8_ = auVar350._0_8_;
  auVar199._12_4_ = auVar350._12_4_;
  auVar294 = minps(auVar199,auVar295);
  auVar230 = maxps(auVar350,auVar295);
  auVar296._8_4_ = auVar330._8_4_;
  auVar296._0_8_ = auVar330._0_8_;
  auVar296._12_4_ = auVar330._12_4_;
  auVar158 = minps(auVar296,auVar420);
  auVar294 = minps(auVar294,auVar158);
  auVar158 = maxps(auVar330,auVar420);
  auVar232 = maxps(auVar230,auVar158);
  auVar297._8_4_ = auVar374._8_4_;
  auVar297._0_8_ = auVar374._0_8_;
  auVar297._12_4_ = auVar374._12_4_;
  auVar158 = minps(auVar297,auVar431);
  auVar375 = maxps(auVar374,auVar431);
  auVar331._8_4_ = auVar361._8_4_;
  auVar331._0_8_ = auVar361._0_8_;
  auVar331._12_4_ = auVar361._12_4_;
  auVar230 = minps(auVar331,auVar175);
  auVar158 = minps(auVar158,auVar230);
  auVar294 = minps(auVar294,auVar158);
  auVar158 = maxps(auVar361,auVar175);
  auVar158 = maxps(auVar375,auVar158);
  auVar158 = maxps(auVar232,auVar158);
  bVar136 = auVar294._4_4_ <= fStack_154;
  bVar27 = auVar294._8_4_ <= fStack_150;
  bVar28 = auVar294._12_4_ <= fStack_14c;
  auVar103._4_4_ = -(uint)bVar27;
  auVar103._0_4_ = -(uint)bVar136;
  auVar103._8_4_ = -(uint)bVar28;
  auVar103._12_4_ = 0;
  auVar203 = auVar103 << 0x20;
  auVar351._0_4_ =
       -(uint)(local_168 <= auVar158._0_4_ && auVar294._0_4_ <= local_158) & local_178._0_4_;
  auVar351._4_4_ = -(uint)(fStack_164 <= auVar158._4_4_ && bVar136) & local_178._4_4_;
  auVar351._8_4_ = -(uint)(fStack_160 <= auVar158._8_4_ && bVar27) & local_178._8_4_;
  auVar351._12_4_ = -(uint)(fStack_15c <= auVar158._12_4_ && bVar28) & local_178._12_4_;
  uVar139 = movmskps((int)uVar131,auVar351);
  paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar139;
  if (uVar139 != 0) {
    fVar435 = (fVar311 - fVar310) + (fStack_254 - local_258);
    fVar258 = (fVar314 - fVar311) + (fStack_250 - fStack_254);
    fVar305 = (fVar339 - fVar314) + (fStack_24c - fStack_250);
    fVar192 = (0.0 - fVar339) + (0.0 - fStack_24c);
    fVar340 = (fVar307 - fVar259) + (fStack_144 - local_148);
    fVar348 = (fVar317 - fVar307) + (fStack_140 - fStack_144);
    fVar357 = (fVar260 - fVar317) + (fStack_13c - fStack_140);
    fVar369 = (0.0 - fVar260) + (0.0 - fStack_13c);
    auVar439._0_8_ =
         CONCAT44(fStack_144 * fVar258 - fStack_254 * fVar348,
                  local_148 * fVar435 - local_258 * fVar340);
    auVar439._8_4_ = fStack_140 * fVar305 - fStack_250 * fVar357;
    auVar439._12_4_ = fStack_13c * fVar192 - fStack_24c * fVar369;
    auVar298._0_4_ = (float)local_328._0_4_ * fVar435 - local_238 * fVar340;
    auVar298._4_4_ = (float)local_328._4_4_ * fVar258 - fStack_234 * fVar348;
    auVar298._8_4_ = fStack_320 * fVar305 - fStack_230 * fVar357;
    auVar298._12_4_ = fStack_31c * fVar192 - fStack_22c * fVar369;
    auVar362._0_8_ =
         CONCAT44(auVar172._4_4_ * fVar258 - local_248._4_4_ * fVar348,
                  auVar172._0_4_ * fVar435 - local_248._0_4_ * fVar340);
    auVar362._8_4_ = auVar172._8_4_ * fVar305 - local_248._8_4_ * fVar357;
    auVar362._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
    auVar332._0_4_ = fStack_144 * fVar435 - fStack_254 * fVar340;
    auVar332._4_4_ = fStack_140 * fVar258 - fStack_250 * fVar348;
    auVar332._8_4_ = fStack_13c * fVar305 - fStack_24c * fVar357;
    auVar332._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
    auVar237._0_8_ =
         CONCAT44(fVar307 * fVar258 - fVar311 * fVar348,fVar259 * fVar435 - fVar310 * fVar340);
    auVar237._8_4_ = fVar317 * fVar305 - fVar314 * fVar357;
    auVar237._12_4_ = fVar260 * fVar192 - fVar339 * fVar369;
    auVar392._0_4_ = local_108 * fVar435 - local_138 * fVar340;
    auVar392._4_4_ = fStack_104 * fVar258 - fStack_134 * fVar348;
    auVar392._8_4_ = fStack_100 * fVar305 - fStack_130 * fVar357;
    auVar392._12_4_ = fStack_fc * fVar192 - fStack_12c * fVar369;
    auVar421._0_8_ =
         CONCAT44(local_128._4_4_ * fVar258 - local_d8._4_4_ * fVar348,
                  local_128._0_4_ * fVar435 - local_d8._0_4_ * fVar340);
    auVar421._8_4_ = local_128._8_4_ * fVar305 - local_d8._8_4_ * fVar357;
    auVar421._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
    auVar175._0_4_ = fVar435 * fVar307 - fVar340 * fVar311;
    auVar175._4_4_ = fVar258 * fVar317 - fVar348 * fVar314;
    auVar175._8_4_ = fVar305 * fVar260 - fVar357 * fVar339;
    auVar175._12_4_ = fVar192 * 0.0 - fVar369 * 0.0;
    auVar200._8_4_ = auVar439._8_4_;
    auVar200._0_8_ = auVar439._0_8_;
    auVar200._12_4_ = auVar439._12_4_;
    auVar294 = minps(auVar200,auVar298);
    auVar230 = maxps(auVar439,auVar298);
    auVar299._8_4_ = auVar362._8_4_;
    auVar299._0_8_ = auVar362._0_8_;
    auVar299._12_4_ = auVar362._12_4_;
    auVar158 = minps(auVar299,auVar332);
    auVar294 = minps(auVar294,auVar158);
    auVar158 = maxps(auVar362,auVar332);
    auVar375 = maxps(auVar230,auVar158);
    auVar300._8_4_ = auVar237._8_4_;
    auVar300._0_8_ = auVar237._0_8_;
    auVar300._12_4_ = auVar237._12_4_;
    auVar230 = minps(auVar300,auVar392);
    auVar158 = maxps(auVar237,auVar392);
    auVar333._8_4_ = auVar421._8_4_;
    auVar333._0_8_ = auVar421._0_8_;
    auVar333._12_4_ = auVar421._12_4_;
    auVar232 = minps(auVar333,auVar175);
    auVar230 = minps(auVar230,auVar232);
    auVar294 = minps(auVar294,auVar230);
    auVar230 = maxps(auVar421,auVar175);
    auVar158 = maxps(auVar158,auVar230);
    auVar158 = maxps(auVar375,auVar158);
    bVar136 = auVar294._4_4_ <= fStack_154;
    bVar27 = auVar294._8_4_ <= fStack_150;
    bVar28 = auVar294._12_4_ <= fStack_14c;
    auVar104._4_4_ = -(uint)bVar27;
    auVar104._0_4_ = -(uint)bVar136;
    auVar104._8_4_ = -(uint)bVar28;
    auVar104._12_4_ = 0;
    auVar203 = auVar104 << 0x20;
    auVar440._0_4_ =
         -(uint)(local_168 <= auVar158._0_4_ && auVar294._0_4_ <= local_158) & auVar351._0_4_;
    auVar440._4_4_ = -(uint)(fStack_164 <= auVar158._4_4_ && bVar136) & auVar351._4_4_;
    auVar440._8_4_ = -(uint)(fStack_160 <= auVar158._8_4_ && bVar27) & auVar351._8_4_;
    auVar440._12_4_ = -(uint)(fStack_15c <= auVar158._12_4_ && bVar28) & auVar351._12_4_;
    uVar139 = movmskps(uVar139,auVar440);
    paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar139;
    auVar431 = local_118;
    if (uVar139 != 0) {
      auStack_208[uVar135] = uVar139 & 0xff;
      *(undefined8 *)(afStack_78 + uVar135 * 2) = local_428;
      *(undefined1 (*) [8])(afStack_58 + uVar135 * 2) = local_418;
      uVar135 = (ulong)((int)uVar135 + 1);
      paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar139;
      auVar175 = _local_418;
    }
  }
LAB_0038c7fe:
  _local_408 = auVar172;
  auVar294 = _local_408;
  if ((int)uVar135 == 0) {
    fVar435 = (ray->super_RayK<1>).tfar;
    auVar208._4_4_ = -(uint)(fStack_1c4 <= fVar435);
    auVar208._0_4_ = -(uint)(local_1c8 <= fVar435);
    auVar208._8_4_ = -(uint)(fStack_1c0 <= fVar435);
    auVar208._12_4_ = -(uint)(fStack_1bc <= fVar435);
    uVar138 = movmskps((int)paVar132,auVar208);
    uVar137 = uVar137 & uVar137 + 0xf & uVar138;
    goto LAB_0038b3cd;
  }
  uVar140 = (int)uVar135 - 1;
  uVar131 = (ulong)uVar140;
  uVar139 = auStack_208[uVar131];
  local_418._0_4_ = afStack_58[uVar131 * 2];
  local_418._4_4_ = afStack_58[uVar131 * 2 + 1];
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  uVar10 = 0;
  if (uVar139 != 0) {
    for (; (uVar139 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  uVar139 = uVar139 - 1 & uVar139;
  auStack_208[uVar131] = uVar139;
  if (uVar139 == 0) {
    uVar135 = (ulong)uVar140;
  }
  fVar192 = (float)(uVar10 + 1) * 0.33333334;
  fVar259 = auVar175._4_4_ * 0.0;
  fVar307 = auVar203._4_4_ * 0.0;
  fVar435 = afStack_78[uVar131 * 2];
  fVar258 = afStack_78[uVar131 * 2 + 1];
  fVar305 = fVar435 * (1.0 - (float)uVar10 * 0.33333334) + fVar258 * (float)uVar10 * 0.33333334;
  fVar192 = fVar435 * (1.0 - fVar192) + fVar258 * fVar192;
  fVar317 = fVar435 * (0.0 - fVar259) + fVar258 * fVar259;
  fVar307 = fVar435 * (0.0 - fVar307) + fVar258 * fVar307;
  fVar259 = fVar192 - fVar305;
  fVar311 = (float)local_338;
  fVar314 = local_338._4_4_;
  fVar435 = (float)uStack_330;
  fVar258 = uStack_330._4_4_;
  if (fVar259 < 0.16666667) {
    fVar357 = 1.0 - (float)local_418._0_4_;
    fVar370 = 1.0 - (float)local_418._0_4_;
    fVar397 = 1.0 - (float)local_418._4_4_;
    fVar413 = 1.0 - (float)local_418._4_4_;
    fVar348 = local_2b8._0_4_ * fVar357 + local_2e8 * (float)local_418._0_4_;
    fVar369 = local_2b8._4_4_ * fVar370 + fStack_2e4 * (float)local_418._0_4_;
    fVar381 = local_2b8._8_4_ * fVar397 + fStack_2e0 * (float)local_418._4_4_;
    fVar384 = local_2b8._12_4_ * fVar413 + fStack_2dc * (float)local_418._4_4_;
    fVar260 = local_2c8._0_4_ * fVar357 + (float)local_2f8._0_4_ * (float)local_418._0_4_;
    fVar310 = local_2c8._4_4_ * fVar370 + (float)local_2f8._4_4_ * (float)local_418._0_4_;
    fVar339 = local_2c8._8_4_ * fVar397 + fStack_2f0 * (float)local_418._4_4_;
    fVar340 = local_2c8._12_4_ * fVar413 + fStack_2ec * (float)local_418._4_4_;
    fVar254 = (float)local_338 * fVar357 + local_308 * (float)local_418._0_4_;
    fVar256 = local_338._4_4_ * fVar370 + fStack_304 * (float)local_418._0_4_;
    fVar445 = (float)uStack_330 * fVar397 + fStack_300 * (float)local_418._4_4_;
    fVar429 = uStack_330._4_4_ * fVar413 + fStack_2fc * (float)local_418._4_4_;
    fVar417 = (fVar357 * (float)local_2d8._0_4_ + (float)local_418._0_4_ * (float)local_318._0_4_) -
              fVar254;
    fVar428 = (fVar370 * (float)local_2d8._4_4_ + (float)local_418._0_4_ * (float)local_318._4_4_) -
              fVar256;
    fVar433 = (fVar397 * fStack_2d0 + (float)local_418._4_4_ * fStack_310) - fVar445;
    fVar423 = (fVar413 * fStack_2cc + (float)local_418._4_4_ * fStack_30c) - fVar429;
    fVar357 = fVar305 * (fVar254 - fVar260) + fVar260;
    fVar370 = fVar305 * (fVar256 - fVar310) + fVar310;
    fVar397 = fVar305 * (fVar445 - fVar339) + fVar339;
    fVar413 = fVar305 * (fVar429 - fVar340) + fVar340;
    fVar425 = (fVar254 - fVar260) * fVar192 + fVar260;
    fVar442 = (fVar256 - fVar310) * fVar192 + fVar310;
    fVar446 = (fVar445 - fVar339) * fVar192 + fVar339;
    fVar434 = (fVar429 - fVar340) * fVar192 + fVar340;
    fVar436 = fVar305 * (fVar260 - fVar348) + fVar348;
    fVar437 = fVar305 * (fVar310 - fVar369) + fVar369;
    fVar438 = fVar305 * (fVar339 - fVar381) + fVar381;
    fVar447 = fVar305 * (fVar340 - fVar384) + fVar384;
    fVar436 = (fVar357 - fVar436) * fVar305 + fVar436;
    fVar437 = (fVar370 - fVar437) * fVar305 + fVar437;
    fVar438 = (fVar397 - fVar438) * fVar305 + fVar438;
    fVar447 = (fVar413 - fVar447) * fVar305 + fVar447;
    fVar357 = (((fVar305 * fVar417 + fVar254) - fVar357) * fVar305 + fVar357) - fVar436;
    fVar370 = (((fVar305 * fVar428 + fVar256) - fVar370) * fVar305 + fVar370) - fVar437;
    fVar397 = (((fVar305 * fVar433 + fVar445) - fVar397) * fVar305 + fVar397) - fVar438;
    fVar413 = (((fVar305 * fVar423 + fVar429) - fVar413) * fVar305 + fVar413) - fVar447;
    auVar238._0_4_ = fVar305 * fVar357 + fVar436;
    auVar238._4_4_ = fVar305 * fVar370 + fVar437;
    auVar238._8_4_ = fVar305 * fVar397 + fVar438;
    auVar238._12_4_ = fVar305 * fVar413 + fVar447;
    fVar348 = (fVar260 - fVar348) * fVar192 + fVar348;
    fVar369 = (fVar310 - fVar369) * fVar192 + fVar369;
    fVar381 = (fVar339 - fVar381) * fVar192 + fVar381;
    fVar384 = (fVar340 - fVar384) * fVar192 + fVar384;
    fVar348 = (fVar425 - fVar348) * fVar192 + fVar348;
    fVar369 = (fVar442 - fVar369) * fVar192 + fVar369;
    fVar381 = (fVar446 - fVar381) * fVar192 + fVar381;
    fVar384 = (fVar434 - fVar384) * fVar192 + fVar384;
    fVar310 = (((fVar417 * fVar192 + fVar254) - fVar425) * fVar192 + fVar425) - fVar348;
    fVar339 = (((fVar428 * fVar192 + fVar256) - fVar442) * fVar192 + fVar442) - fVar369;
    fVar340 = (((fVar433 * fVar192 + fVar445) - fVar446) * fVar192 + fVar446) - fVar381;
    fVar442 = (((fVar423 * fVar192 + fVar429) - fVar434) * fVar192 + fVar434) - fVar384;
    fVar348 = fVar192 * fVar310 + fVar348;
    fVar369 = fVar192 * fVar339 + fVar369;
    fVar381 = fVar192 * fVar340 + fVar381;
    fVar384 = fVar192 * fVar442 + fVar384;
    fVar260 = fVar259 * 0.33333334;
    fVar417 = fVar357 * (float)DAT_01f4afa0 * fVar260 + auVar238._0_4_;
    fVar428 = fVar370 * DAT_01f4afa0._4_4_ * fVar260 + auVar238._4_4_;
    fVar433 = fVar397 * DAT_01f4afa0._8_4_ * fVar260 + auVar238._8_4_;
    fVar423 = fVar413 * DAT_01f4afa0._12_4_ * fVar260 + auVar238._12_4_;
    fVar254 = fVar348 - fVar260 * fVar310 * (float)DAT_01f4afa0;
    fVar425 = fVar369 - fVar260 * fVar339 * DAT_01f4afa0._4_4_;
    fVar256 = fVar381 - fVar260 * fVar340 * DAT_01f4afa0._8_4_;
    fVar442 = fVar384 - fVar260 * fVar442 * DAT_01f4afa0._12_4_;
    auVar31._4_8_ = auVar431._8_8_;
    auVar31._0_4_ = auVar238._4_4_;
    auVar430._0_8_ = auVar31._0_8_ << 0x20;
    auVar430._8_4_ = auVar238._8_4_;
    auVar430._12_4_ = auVar238._12_4_;
    auVar431._8_8_ = auVar238._8_8_;
    auVar431._0_8_ = auVar430._8_8_;
    auVar32._4_8_ = DAT_01f4afa0._8_8_;
    auVar32._0_4_ = fVar369;
    auVar363._0_8_ = auVar32._0_8_ << 0x20;
    auVar363._8_4_ = fVar381;
    auVar363._12_4_ = fVar384;
    fVar357 = (fVar381 - fVar348) + (auVar238._8_4_ - auVar238._0_4_);
    fVar370 = (fVar384 - fVar369) + (auVar238._12_4_ - auVar238._4_4_);
    auVar376._0_4_ = fVar425 * fVar370;
    auVar376._4_4_ = fVar425 * fVar370;
    auVar376._8_4_ = fVar442 * fVar370;
    auVar376._12_4_ = fVar442 * fVar370;
    fVar260 = auVar238._0_4_ * fVar357 + auVar238._4_4_ * fVar370;
    fVar310 = auVar238._8_4_ * fVar357 + auVar238._12_4_ * fVar370;
    fVar397 = fVar417 * fVar357 + fVar428 * fVar370;
    fVar413 = fVar433 * fVar357 + fVar423 * fVar370;
    fVar445 = fVar254 * fVar357 + auVar376._0_4_;
    auVar352._0_8_ = CONCAT44(fVar425 * fVar357 + auVar376._4_4_,fVar445);
    auVar352._8_4_ = fVar256 * fVar357 + auVar376._8_4_;
    auVar352._12_4_ = fVar442 * fVar357 + auVar376._12_4_;
    fVar340 = fVar357 * fVar348 + fVar370 * fVar369;
    fVar446 = fVar357 * fVar381 + fVar370 * fVar384;
    auVar33._4_8_ = auVar376._8_8_;
    auVar33._0_4_ = fVar428 * fVar357 + fVar428 * fVar370;
    auVar377._0_8_ = auVar33._0_8_ << 0x20;
    auVar377._8_4_ = fVar413;
    auVar377._12_4_ = fVar423 * fVar357 + fVar423 * fVar370;
    fVar339 = fVar397;
    if (fVar397 <= fVar260) {
      fVar339 = fVar260;
      fVar260 = fVar397;
    }
    auVar378._8_8_ = auVar377._8_8_;
    auVar378._0_8_ = auVar378._8_8_;
    auVar173._8_4_ = auVar352._8_4_;
    auVar173._0_8_ = auVar352._0_8_;
    auVar173._12_4_ = auVar352._12_4_;
    if (fVar340 <= fVar445) {
      auVar173._0_4_ = fVar340;
    }
    if (auVar173._0_4_ <= fVar260) {
      fVar260 = auVar173._0_4_;
    }
    auVar34._4_8_ = auVar173._8_8_;
    auVar34._0_4_ = fVar357 * fVar369 + fVar370 * fVar369;
    auVar174._0_8_ = auVar34._0_8_ << 0x20;
    auVar174._8_4_ = fVar446;
    auVar174._12_4_ = fVar357 * fVar384 + fVar370 * fVar384;
    if (fVar340 <= fVar445) {
      fVar340 = fVar445;
    }
    auVar175._8_8_ = auVar174._8_8_;
    auVar175._0_8_ = auVar175._8_8_;
    if (fVar340 <= fVar339) {
      fVar340 = fVar339;
    }
    if (fVar413 <= fVar310) {
      auVar378._0_4_ = fVar310;
      fVar310 = fVar413;
    }
    auVar201._8_4_ = auVar352._8_4_;
    auVar201._0_8_ = auVar352._8_8_;
    auVar201._12_4_ = auVar352._12_4_;
    if (fVar446 <= auVar352._8_4_) {
      auVar201._0_4_ = fVar446;
    }
    if (auVar201._0_4_ <= fVar310) {
      fVar310 = auVar201._0_4_;
    }
    if (fVar446 <= auVar352._8_4_) {
      auVar175._0_4_ = auVar352._8_4_;
    }
    if (auVar175._0_4_ <= auVar378._0_4_) {
      auVar175._0_4_ = auVar378._0_4_;
    }
    bVar136 = 3 < (uint)uVar135;
    uVar35 = (undefined3)(uVar140 >> 8);
    fVar339 = auVar175._0_4_;
    if ((0.0001 <= fVar260) || (fVar339 <= -0.0001)) goto LAB_0038cb18;
    goto LAB_0038cb61;
  }
  goto LAB_0038c19b;
LAB_0038cb18:
  auVar203._0_12_ = ZEXT812(0x38d1b717);
  auVar203._12_4_ = 0.0;
  if ((0.0001 <= fVar310 || fVar340 <= -0.0001) &&
     ((0.0001 <= fVar260 || fVar340 <= -0.0001 &&
      (paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar35,bVar136),
      auVar172 = _local_408, 0.0001 <= fVar310 || fVar339 <= -0.0001)))) goto LAB_0038c7fe;
LAB_0038cb61:
  _local_328 = auVar431;
  _local_408 = auVar363._8_8_;
  auVar172 = _local_408;
  bVar136 = bVar136 || fVar259 < 0.001;
  paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar35,bVar136);
  fVar370 = (float)(~-(uint)(fVar260 < 0.0) & 0x3f800000 | -(uint)(fVar260 < 0.0) & 0xbf800000);
  fVar397 = (float)(~-(uint)(fVar340 < 0.0) & 0x3f800000 | -(uint)(fVar340 < 0.0) & 0xbf800000);
  fVar357 = 0.0;
  if ((fVar370 == fVar397) && (!NAN(fVar370) && !NAN(fVar397))) {
    fVar357 = INFINITY;
  }
  fVar413 = 0.0;
  if ((fVar370 == fVar397) && (!NAN(fVar370) && !NAN(fVar397))) {
    fVar413 = -INFINITY;
  }
  fVar445 = (float)(~-(uint)(fVar310 < 0.0) & 0x3f800000 | -(uint)(fVar310 < 0.0) & 0xbf800000);
  if ((fVar370 != fVar445) || (fVar446 = fVar413, NAN(fVar370) || NAN(fVar445))) {
    if ((fVar310 != fVar260) || (NAN(fVar310) || NAN(fVar260))) {
      fVar310 = -fVar260 / (fVar310 - fVar260);
      fVar310 = (1.0 - fVar310) * 0.0 + fVar310;
      fVar446 = fVar310;
    }
    else {
      fVar310 = 0.0;
      if ((fVar260 != 0.0) || (fVar446 = 1.0, NAN(fVar260))) {
        fVar310 = INFINITY;
        fVar446 = -INFINITY;
      }
    }
    if (fVar310 <= fVar357) {
      fVar357 = fVar310;
    }
    if (fVar446 <= fVar413) {
      fVar446 = fVar413;
    }
  }
  fVar260 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar339 < 0.0) * 4);
  if ((fVar397 != fVar260) || (fVar310 = fVar446, NAN(fVar397) || NAN(fVar260))) {
    if ((fVar339 != fVar340) || (NAN(fVar339) || NAN(fVar340))) {
      fVar370 = -fVar340 / (fVar339 - fVar340);
      fVar370 = (1.0 - fVar370) * 0.0 + fVar370;
      fVar310 = fVar370;
    }
    else {
      fVar370 = 0.0;
      if ((fVar340 != 0.0) || (fVar310 = 1.0, NAN(fVar340))) {
        fVar370 = INFINITY;
        fVar310 = -INFINITY;
      }
    }
    if (fVar370 <= fVar357) {
      fVar357 = fVar370;
    }
    if (fVar310 <= fVar446) {
      fVar310 = fVar446;
    }
  }
  if ((fVar445 != fVar260) || (NAN(fVar445) || NAN(fVar260))) {
    fVar357 = (float)(~-(uint)(fVar357 < 1.0) & 0x3f800000 | (uint)fVar357 & -(uint)(fVar357 < 1.0))
    ;
    fVar310 = (float)(~-(uint)(fVar310 < 1.0) & (uint)fVar310 | -(uint)(fVar310 < 1.0) & 0x3f800000)
    ;
  }
  auVar431._0_12_ = ZEXT812(0x3f800000);
  auVar431._12_4_ = 0.0;
  auVar202._0_8_ =
       CONCAT44(~-(uint)(fVar310 < 1.0),~-(uint)(fVar357 < 0.0) & (uint)fVar357) &
       0x3f800000ffffffff;
  auVar202._8_8_ = 0;
  auVar203 = auVar202 | ZEXT416((uint)fVar310 & -(uint)(fVar310 < 1.0)) << 0x20;
  fVar260 = auVar203._4_4_;
  auVar175._4_4_ = fVar260;
  auVar175._0_4_ = fVar260;
  auVar175._8_4_ = fVar260;
  auVar175._12_4_ = fVar260;
  fStack_400 = auVar294._8_4_;
  fStack_3fc = auVar294._12_4_;
  if (fVar260 < auVar203._0_4_) goto LAB_0038c7fe;
  fVar310 = auVar203._0_4_ + -0.1;
  fVar340 = auVar203._8_4_ + 0.0;
  fVar357 = auVar203._12_4_ + 0.0;
  uVar139 = -(uint)(fVar260 + 0.1 < 1.0);
  fVar310 = (float)(~-(uint)(fVar310 < 0.0) & (uint)fVar310);
  fVar260 = (float)(~uVar139 & 0x3f800000 | (uint)(fVar260 + 0.1) & uVar139);
  fVar434 = 1.0 - fVar310;
  fVar436 = 1.0 - fVar310;
  fVar437 = 1.0 - fVar260;
  fVar438 = 1.0 - fVar260;
  fVar370 = auVar238._0_4_ * fVar434 + auVar238._8_4_ * fVar310;
  fVar397 = auVar238._4_4_ * fVar436 + auVar238._12_4_ * fVar310;
  fVar413 = auVar238._0_4_ * fVar437 + auVar238._8_4_ * fVar260;
  fVar445 = auVar238._4_4_ * fVar438 + auVar238._12_4_ * fVar260;
  fVar446 = fVar417 * fVar434 + fVar433 * fVar310;
  fVar429 = fVar428 * fVar436 + fVar423 * fVar310;
  fVar417 = fVar417 * fVar437 + fVar433 * fVar260;
  fVar428 = fVar428 * fVar438 + fVar423 * fVar260;
  fVar433 = fVar254 * fVar434 + fVar256 * fVar310;
  fVar423 = fVar425 * fVar436 + fVar442 * fVar310;
  fVar254 = fVar254 * fVar437 + fVar256 * fVar260;
  fVar425 = fVar425 * fVar438 + fVar442 * fVar260;
  fVar381 = fVar434 * fVar348 + fVar381 * fVar310;
  fVar384 = fVar436 * fVar369 + fVar384 * fVar310;
  fVar256 = fVar437 * fVar348 + fStack_400 * fVar260;
  fVar442 = fVar438 * fVar369 + fStack_3fc * fVar260;
  fVar348 = (float)local_418._4_4_ * fVar340;
  fVar369 = (float)local_418._4_4_ * fVar357;
  fVar434 = (float)local_418._0_4_ * (1.0 - fVar260);
  fStack_410 = (float)local_418._0_4_ * (0.0 - fVar340);
  fStack_40c = (float)local_418._0_4_ * (0.0 - fVar357);
  local_418._0_4_ = (float)local_418._0_4_ * (1.0 - fVar310) + (float)local_418._4_4_ * fVar310;
  local_418._4_4_ = fVar434 + (float)local_418._4_4_ * fVar260;
  fStack_410 = fStack_410 + fVar348;
  fStack_40c = fStack_40c + fVar369;
  fVar259 = 1.0 / fVar259;
  auVar204._0_4_ = fVar256 - fVar381;
  auVar204._4_4_ = fVar442 - fVar384;
  auVar204._8_4_ = fVar256 - fVar256;
  auVar204._12_4_ = fVar442 - fVar442;
  auVar250._0_8_ = CONCAT44(fVar425 - fVar423,fVar254 - fVar433);
  auVar250._8_4_ = fVar254 - fVar254;
  auVar250._12_4_ = fVar425 - fVar425;
  auVar334._0_4_ = fVar417 - fVar446;
  auVar334._4_4_ = fVar428 - fVar429;
  auVar334._8_4_ = fVar417 - fVar417;
  auVar334._12_4_ = fVar428 - fVar428;
  auVar379._0_8_ = CONCAT44((fVar429 - fVar397) * 3.0,(fVar446 - fVar370) * 3.0);
  auVar379._8_4_ = (fVar417 - fVar413) * 3.0;
  auVar379._12_4_ = (fVar428 - fVar445) * 3.0;
  auVar301._0_8_ = CONCAT44((fVar423 - fVar429) * 3.0,(fVar433 - fVar446) * 3.0);
  auVar301._8_4_ = (fVar254 - fVar417) * 3.0;
  auVar301._12_4_ = (fVar425 - fVar428) * 3.0;
  auVar409._0_4_ = (fVar381 - fVar433) * 3.0;
  auVar409._4_4_ = (fVar384 - fVar423) * 3.0;
  auVar409._8_4_ = (fVar256 - fVar254) * 3.0;
  auVar409._12_4_ = (fVar442 - fVar425) * 3.0;
  auVar353._8_4_ = auVar301._8_4_;
  auVar353._0_8_ = auVar301._0_8_;
  auVar353._12_4_ = auVar301._12_4_;
  auVar158 = minps(auVar353,auVar409);
  auVar294 = maxps(auVar301,auVar409);
  auVar393._8_4_ = auVar379._8_4_;
  auVar393._0_8_ = auVar379._0_8_;
  auVar393._12_4_ = auVar379._12_4_;
  auVar232 = minps(auVar393,auVar158);
  auVar230 = maxps(auVar379,auVar294);
  auVar36._4_8_ = auVar294._8_8_;
  auVar36._0_4_ = auVar232._4_4_;
  auVar302._0_8_ = auVar36._0_8_ << 0x20;
  auVar302._8_4_ = auVar232._8_4_;
  auVar302._12_4_ = auVar232._12_4_;
  auVar303._8_8_ = auVar232._8_8_;
  auVar303._0_8_ = auVar302._8_8_;
  auVar37._4_8_ = auVar158._8_8_;
  auVar37._0_4_ = auVar230._4_4_;
  auVar354._0_8_ = auVar37._0_8_ << 0x20;
  auVar354._8_4_ = auVar230._8_4_;
  auVar354._12_4_ = auVar230._12_4_;
  auVar355._8_8_ = auVar230._8_8_;
  auVar355._0_8_ = auVar354._8_8_;
  auVar158 = minps(auVar232,auVar303);
  auVar294 = maxps(auVar230,auVar355);
  fVar436 = auVar158._0_4_ * fVar259;
  fVar437 = auVar158._4_4_ * fVar259;
  fVar438 = auVar158._8_4_ * fVar259;
  fVar447 = auVar158._12_4_ * fVar259;
  fVar428 = fVar259 * auVar294._0_4_;
  fVar423 = fVar259 * auVar294._4_4_;
  fVar425 = fVar259 * auVar294._8_4_;
  fVar259 = fVar259 * auVar294._12_4_;
  fVar429 = 1.0 / ((float)local_418._4_4_ - (float)local_418._0_4_);
  auVar176._0_8_ = CONCAT44(fVar445 - fVar397,fVar413 - fVar370);
  auVar176._8_4_ = fVar413 - fVar413;
  auVar176._12_4_ = fVar445 - fVar445;
  auVar364._8_4_ = auVar176._8_4_;
  auVar364._0_8_ = auVar176._0_8_;
  auVar364._12_4_ = auVar176._12_4_;
  auVar230 = minps(auVar364,auVar334);
  auVar294 = maxps(auVar176,auVar334);
  auVar239._8_4_ = auVar250._8_4_;
  auVar239._0_8_ = auVar250._0_8_;
  auVar239._12_4_ = auVar250._12_4_;
  auVar158 = minps(auVar239,auVar204);
  auVar230 = minps(auVar230,auVar158);
  auVar158 = maxps(auVar250,auVar204);
  auVar294 = maxps(auVar294,auVar158);
  fVar445 = auVar230._0_4_ * fVar429;
  fVar446 = auVar230._4_4_ * fVar429;
  fVar434 = fVar429 * auVar294._0_4_;
  fVar429 = fVar429 * auVar294._4_4_;
  stack0xfffffffffffffbfc = local_418._0_4_;
  local_408._0_4_ = fVar305;
  fStack_400 = fVar192;
  fStack_3fc = (float)local_418._4_4_;
  auVar356._4_4_ = local_418._4_4_;
  auVar356._0_4_ = fVar192;
  auVar356._8_4_ = fVar317;
  auVar356._12_4_ = fVar307;
  fVar384 = (fVar305 + fVar192) * 0.5;
  fVar397 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
  fVar413 = (fVar192 + fVar317) * 0.0;
  fVar417 = ((float)local_418._4_4_ + fVar307) * 0.0;
  fVar260 = local_88 * fVar384 + (float)local_358;
  fVar310 = fStack_84 * fVar384 + local_358._4_4_;
  fVar340 = fStack_80 * fVar384 + (float)uStack_350;
  fVar348 = fStack_7c * fVar384 + uStack_350._4_4_;
  fVar357 = local_98 * fVar384 + (float)local_368._0_4_;
  fVar369 = fStack_94 * fVar384 + stack0xfffffffffffffc9c;
  fVar370 = fStack_90 * fVar384 + fStack_360;
  fVar381 = fStack_8c * fVar384 + fStack_35c;
  fVar260 = (fVar357 - fVar260) * fVar384 + fVar260;
  fVar310 = (fVar369 - fVar310) * fVar384 + fVar310;
  fVar340 = (fVar370 - fVar340) * fVar384 + fVar340;
  fVar348 = (fVar381 - fVar348) * fVar384 + fVar348;
  fVar357 = (((local_a8 * fVar384 + (float)local_2a8) - fVar357) * fVar384 + fVar357) - fVar260;
  fVar369 = (((fStack_a4 * fVar384 + local_2a8._4_4_) - fVar369) * fVar384 + fVar369) - fVar310;
  fVar370 = (((fStack_a0 * fVar384 + fStack_2a0) - fVar370) * fVar384 + fVar370) - fVar340;
  fVar381 = (((fStack_9c * fVar384 + fStack_29c) - fVar381) * fVar384 + fVar381) - fVar348;
  fVar260 = fVar384 * fVar357 + fVar260;
  fVar310 = fVar384 * fVar369 + fVar310;
  fVar357 = fVar357 * 3.0;
  fVar369 = fVar369 * 3.0;
  fVar340 = (fVar384 * fVar370 + fVar340) - fVar260;
  fVar348 = (fVar384 * fVar381 + fVar348) - fVar310;
  fVar357 = (fVar370 * 3.0 - fVar357) * fVar397 + fVar357;
  fVar369 = (fVar381 * 3.0 - fVar369) * fVar397 + fVar369;
  auVar251._0_8_ = CONCAT44(fVar357,fVar340) ^ 0x80000000;
  auVar251._8_4_ = fVar357;
  auVar251._12_4_ = fVar357;
  fVar448 = fVar305 - fVar384;
  fVar209 = (float)local_418._0_4_ - fVar397;
  fVar210 = fVar192 - fVar413;
  fVar211 = (float)local_418._4_4_ - fVar417;
  fVar213 = fVar192 - fVar384;
  fVar407 = (float)local_418._4_4_ - fVar397;
  fVar317 = fVar317 - fVar413;
  fVar307 = fVar307 - fVar417;
  fVar260 = fVar340 * fVar397 + fVar260;
  fVar310 = fVar348 * fVar397 + fVar310;
  auVar304._0_8_ = CONCAT44(fVar369,fVar348) ^ 0x8000000000000000;
  auVar304._8_4_ = -fVar369;
  auVar304._12_4_ = -fVar369;
  auVar177._0_4_ = fVar348 * fVar357 - fVar369 * fVar340;
  auVar177._4_4_ = auVar177._0_4_;
  auVar177._8_4_ = auVar177._0_4_;
  auVar177._12_4_ = auVar177._0_4_;
  auVar158 = divps(auVar304,auVar177);
  auVar294 = divps(auVar251,auVar177);
  fVar413 = auVar158._0_4_;
  fVar417 = auVar158._4_4_;
  fVar370 = auVar294._0_4_;
  fVar381 = auVar294._4_4_;
  fVar384 = fVar384 - (fVar310 * fVar370 + fVar260 * fVar413);
  fVar357 = fVar397 - (fVar310 * fVar381 + fVar260 * fVar417);
  fVar369 = fVar397 - (fVar310 * auVar294._8_4_ + fVar260 * auVar158._8_4_);
  fVar397 = fVar397 - (fVar310 * auVar294._12_4_ + fVar260 * auVar158._12_4_);
  auVar205._0_8_ = CONCAT44(fVar417 * fVar445,fVar417 * fVar436);
  auVar205._8_4_ = fVar417 * fVar437;
  auVar205._12_4_ = fVar417 * fVar446;
  auVar178._0_4_ = fVar417 * fVar428;
  auVar178._4_4_ = fVar417 * fVar434;
  auVar178._8_4_ = fVar417 * fVar423;
  auVar178._12_4_ = fVar417 * fVar429;
  auVar444._8_4_ = auVar205._8_4_;
  auVar444._0_8_ = auVar205._0_8_;
  auVar444._12_4_ = auVar205._12_4_;
  auVar232 = minps(auVar444,auVar178);
  auVar294 = maxps(auVar178,auVar205);
  auVar335._0_8_ = CONCAT44(fVar381 * fVar446,fVar381 * fVar437);
  auVar335._8_4_ = fVar381 * fVar438;
  auVar335._12_4_ = fVar381 * fVar447;
  auVar206._0_4_ = fVar381 * fVar423;
  auVar206._4_4_ = fVar381 * fVar429;
  auVar206._8_4_ = fVar381 * fVar425;
  auVar206._12_4_ = fVar381 * fVar259;
  auVar394._8_4_ = auVar335._8_4_;
  auVar394._0_8_ = auVar335._0_8_;
  auVar394._12_4_ = auVar335._12_4_;
  auVar230 = minps(auVar394,auVar206);
  auVar158 = maxps(auVar206,auVar335);
  fVar260 = 0.0 - (auVar158._0_4_ + auVar294._0_4_);
  fVar310 = 1.0 - (auVar158._4_4_ + auVar294._4_4_);
  fVar340 = 0.0 - (auVar158._8_4_ + auVar294._8_4_);
  fVar348 = 0.0 - (auVar158._12_4_ + auVar294._12_4_);
  fVar433 = 0.0 - (auVar230._0_4_ + auVar232._0_4_);
  fVar254 = 1.0 - (auVar230._4_4_ + auVar232._4_4_);
  fVar256 = 0.0 - (auVar230._8_4_ + auVar232._8_4_);
  fVar442 = 0.0 - (auVar230._12_4_ + auVar232._12_4_);
  auVar207._0_8_ = CONCAT44(fVar209 * fVar310,fVar448 * fVar260);
  auVar207._8_4_ = fVar210 * fVar340;
  auVar207._12_4_ = fVar211 * fVar348;
  auVar410._0_8_ = CONCAT44(fVar445 * fVar413,fVar436 * fVar413);
  auVar410._8_4_ = fVar437 * fVar413;
  auVar410._12_4_ = fVar446 * fVar413;
  auVar336._0_4_ = fVar413 * fVar428;
  auVar336._4_4_ = fVar413 * fVar434;
  auVar336._8_4_ = fVar413 * fVar423;
  auVar336._12_4_ = fVar413 * fVar429;
  auVar395._8_4_ = auVar410._8_4_;
  auVar395._0_8_ = auVar410._0_8_;
  auVar395._12_4_ = auVar410._12_4_;
  auVar158 = minps(auVar395,auVar336);
  auVar294 = maxps(auVar336,auVar410);
  auVar365._0_8_ = CONCAT44(fVar446 * fVar370,fVar437 * fVar370);
  auVar365._8_4_ = fVar438 * fVar370;
  auVar365._12_4_ = fVar447 * fVar370;
  auVar411._0_4_ = fVar370 * fVar423;
  auVar411._4_4_ = fVar370 * fVar429;
  auVar411._8_4_ = fVar370 * fVar425;
  auVar411._12_4_ = fVar370 * fVar259;
  auVar441._8_4_ = auVar365._8_4_;
  auVar441._0_8_ = auVar365._0_8_;
  auVar441._12_4_ = auVar365._12_4_;
  auVar232 = minps(auVar441,auVar411);
  auVar396._0_4_ = fVar448 * fVar433;
  auVar396._4_4_ = fVar209 * fVar254;
  auVar396._8_4_ = fVar210 * fVar256;
  auVar396._12_4_ = fVar211 * fVar442;
  auVar179._0_8_ = CONCAT44(fVar310 * fVar407,fVar260 * fVar213);
  auVar179._8_4_ = fVar340 * fVar317;
  auVar179._12_4_ = fVar348 * fVar307;
  auVar347._0_4_ = fVar433 * fVar213;
  auVar347._4_4_ = fVar254 * fVar407;
  auVar347._8_4_ = fVar256 * fVar317;
  auVar347._12_4_ = fVar442 * fVar307;
  auVar230 = maxps(auVar411,auVar365);
  fVar259 = 1.0 - (auVar230._0_4_ + auVar294._0_4_);
  fVar260 = 0.0 - (auVar230._4_4_ + auVar294._4_4_);
  fVar310 = 0.0 - (auVar230._8_4_ + auVar294._8_4_);
  fVar340 = 0.0 - (auVar230._12_4_ + auVar294._12_4_);
  fVar348 = 1.0 - (auVar232._0_4_ + auVar158._0_4_);
  fVar428 = 0.0 - (auVar232._4_4_ + auVar158._4_4_);
  fVar433 = 0.0 - (auVar232._8_4_ + auVar158._8_4_);
  fVar423 = 0.0 - (auVar232._12_4_ + auVar158._12_4_);
  auVar366._0_8_ = CONCAT44(fVar209 * fVar260,fVar448 * fVar259);
  auVar366._8_4_ = fVar210 * fVar310;
  auVar366._12_4_ = fVar211 * fVar340;
  auVar422._0_4_ = fVar448 * fVar348;
  auVar422._4_4_ = fVar209 * fVar428;
  auVar422._8_4_ = fVar210 * fVar433;
  auVar422._12_4_ = fVar211 * fVar423;
  auVar337._0_8_ = CONCAT44(fVar260 * fVar407,fVar259 * fVar213);
  auVar337._8_4_ = fVar310 * fVar317;
  auVar337._12_4_ = fVar340 * fVar307;
  auVar380._0_4_ = fVar348 * fVar213;
  auVar380._4_4_ = fVar428 * fVar407;
  auVar380._8_4_ = fVar433 * fVar317;
  auVar380._12_4_ = fVar423 * fVar307;
  auVar412._8_4_ = auVar366._8_4_;
  auVar412._0_8_ = auVar366._0_8_;
  auVar412._12_4_ = auVar366._12_4_;
  auVar294 = minps(auVar412,auVar422);
  auVar432._8_4_ = auVar337._8_4_;
  auVar432._0_8_ = auVar337._0_8_;
  auVar432._12_4_ = auVar337._12_4_;
  auVar158 = minps(auVar432,auVar380);
  auVar375 = minps(auVar294,auVar158);
  auVar431._0_12_ = ZEXT812(0x3f800000);
  auVar431._12_4_ = 0.0;
  auVar158 = maxps(auVar422,auVar366);
  auVar294 = maxps(auVar380,auVar337);
  auVar230 = maxps(auVar294,auVar158);
  auVar367._8_4_ = auVar207._8_4_;
  auVar367._0_8_ = auVar207._0_8_;
  auVar367._12_4_ = auVar207._12_4_;
  auVar158 = minps(auVar367,auVar396);
  auVar338._8_4_ = auVar179._8_4_;
  auVar338._0_8_ = auVar179._0_8_;
  auVar338._12_4_ = auVar179._12_4_;
  auVar294 = minps(auVar338,auVar347);
  auVar158 = minps(auVar158,auVar294);
  auVar232 = maxps(auVar396,auVar207);
  auVar294 = maxps(auVar347,auVar179);
  auVar294 = maxps(auVar294,auVar232);
  auVar368._0_4_ = auVar375._4_4_ + auVar375._0_4_ + fVar384;
  auVar368._4_4_ = auVar158._4_4_ + auVar158._0_4_ + fVar357;
  auVar368._8_4_ = auVar375._8_4_ + auVar375._4_4_ + fVar369;
  auVar368._12_4_ = auVar375._12_4_ + auVar158._4_4_ + fVar397;
  fVar259 = auVar230._4_4_ + auVar230._0_4_ + fVar384;
  fVar307 = auVar294._4_4_ + auVar294._0_4_ + fVar357;
  auVar180._4_4_ = fVar307;
  auVar180._0_4_ = fVar259;
  auVar203 = maxps(_local_408,auVar368);
  auVar180._8_4_ = auVar230._8_4_ + auVar230._4_4_ + fVar369;
  auVar180._12_4_ = auVar230._12_4_ + auVar294._4_4_ + fVar397;
  auVar294 = minps(auVar180,auVar356);
  iVar143 = -(uint)(auVar294._0_4_ < auVar203._0_4_);
  iVar188 = -(uint)(auVar294._4_4_ < auVar203._4_4_);
  auVar181._4_4_ = iVar188;
  auVar181._0_4_ = iVar143;
  auVar181._8_4_ = iVar188;
  auVar181._12_4_ = iVar188;
  auVar175._8_8_ = auVar181._8_8_;
  auVar175._4_4_ = (float)iVar143;
  auVar175._0_4_ = (float)iVar143;
  iVar143 = movmskpd((uint)(fVar339 < 0.0),auVar175);
  auVar172 = _local_408;
  if (iVar143 != 0) goto LAB_0038c7fe;
  bVar129 = 0;
  if ((fVar305 < auVar368._0_4_) && (fVar259 < fVar192)) {
    bVar129 = -(fVar307 < (float)local_418._4_4_) & (float)local_418._0_4_ < auVar368._4_4_;
  }
  bVar129 = bVar136 | bVar129;
  uVar131 = (ulong)CONCAT31(uVar35,bVar129);
  if (bVar129 != 1) goto LAB_0038c19b;
  paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0xc9;
  do {
    paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar132 + -1);
    if (paVar132 == (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0) goto LAB_0038c7fe;
    fVar258 = 1.0 - fVar384;
    fVar307 = fVar384 * fVar384 * fVar384;
    fVar259 = fVar384 * fVar384 * 3.0 * fVar258;
    fVar435 = fVar258 * fVar258 * fVar258;
    fVar317 = fVar384 * 3.0 * fVar258 * fVar258;
    fVar258 = fVar435 * (float)local_358 +
              fVar317 * (float)local_368._0_4_ +
              fVar259 * (float)local_2a8 + fVar307 * local_b8._0_4_;
    fVar305 = fVar435 * local_358._4_4_ +
              fVar317 * stack0xfffffffffffffc9c +
              fVar259 * local_2a8._4_4_ + fVar307 * local_b8._4_4_;
    fVar192 = fVar435 * (float)uStack_350 +
              fVar317 * fStack_360 + fVar259 * fStack_2a0 + fVar307 * local_b8._8_4_;
    fVar259 = fVar435 * uStack_350._4_4_ +
              fVar317 * fStack_35c + fVar259 * fStack_29c + fVar307 * local_b8._12_4_;
    fVar307 = (fVar192 - fVar258) * fVar357;
    fVar317 = (fVar259 - fVar305) * fVar357;
    fVar435 = (fVar192 - fVar258) * fVar357 + fVar258;
    fVar192 = (fVar259 - fVar305) * fVar357 + fVar305;
    fVar384 = fVar384 - (fVar192 * fVar370 + fVar435 * fVar413);
    fVar357 = fVar357 - (fVar192 * fVar381 + fVar435 * fVar417);
    fVar259 = ABS(fVar192);
    auVar175._0_8_ = CONCAT44(fVar192,fVar435) & 0x7fffffff7fffffff;
    auVar175._8_4_ = ABS(fVar307 + fVar258);
    auVar175._12_4_ = ABS(fVar317 + fVar305);
    auVar203._0_8_ = CONCAT44(fVar192,fVar192) & 0x7fffffff7fffffff;
    auVar203._8_4_ = fVar259;
    auVar203._12_4_ = fVar259;
    if (fVar259 <= ABS(fVar435)) {
      auVar203._0_4_ = ABS(fVar435);
    }
  } while (local_c8 <= auVar203._0_4_);
  if ((((fVar384 < 0.0) || (1.0 < fVar384)) ||
      (auVar203._4_4_ = fVar357, auVar203._0_4_ = fVar357, auVar203._8_4_ = fVar357,
      auVar203._12_4_ = fVar357, fVar357 < 0.0)) || (1.0 < fVar357)) goto LAB_0038c7fe;
  fVar435 = (pre->ray_space).vx.field_0.m128[2];
  fVar258 = (pre->ray_space).vy.field_0.m128[2];
  fVar305 = (pre->ray_space).vz.field_0.m128[2];
  fVar192 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar259 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar307 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar317 = (ray->super_RayK<1>).org.field_0.m128[3];
  auVar182._0_4_ = (local_398 - fVar192) * fVar435;
  auVar182._4_4_ = (fStack_394 - fVar259) * fVar258;
  auVar182._8_4_ = (fStack_390 - fVar307) * fVar305;
  auVar182._12_4_ = (fStack_38c - fVar317) * 0.0;
  auVar183._8_8_ = auVar182._8_8_;
  auVar183._0_8_ = auVar183._8_8_;
  auVar175._4_12_ = auVar183._4_12_;
  fVar340 = 1.0 - fVar357;
  fVar339 = 1.0 - fVar384;
  fVar260 = fVar339 * fVar339 * fVar339;
  fVar310 = fVar384 * 3.0 * fVar339 * fVar339;
  fVar314 = fVar384 * fVar384 * fVar384;
  fVar311 = fVar384 * fVar384 * 3.0 * fVar339;
  auVar175._0_4_ =
       ((auVar182._8_4_ + auVar182._4_4_ + auVar182._0_4_) * fVar340 +
       ((fStack_380 - fVar307) * fVar305 +
       (fStack_384 - fVar259) * fVar258 + (local_388 - fVar192) * fVar435) * fVar357) * fVar260 +
       (((fStack_3a0 - fVar307) * fVar305 +
        (fStack_3a4 - fVar259) * fVar258 + (local_3a8 - fVar192) * fVar435) * fVar340 +
       ((fStack_370 - fVar307) * fVar305 +
       (fStack_374 - fVar259) * fVar258 + (local_378 - fVar192) * fVar435) * fVar357) * fVar310 +
       (((fStack_3c0 - fVar307) * fVar305 +
        (fStack_3c4 - fVar259) * fVar258 + (local_3c8 - fVar192) * fVar435) * fVar340 +
       ((local_3dc.m128[3] - fVar307) * fVar305 +
       (local_3dc.m128[2] - fVar259) * fVar258 + (local_3dc.m128[1] - fVar192) * fVar435) * fVar357)
       * fVar311 +
       (fVar340 * ((fStack_3b0 - fVar307) * fVar305 +
                  (fStack_3b4 - fVar259) * fVar258 + (local_3b8 - fVar192) * fVar435) +
       ((fStack_210 - fVar307) * fVar305 +
       (fStack_214 - fVar259) * fVar258 + (local_218 - fVar192) * fVar435) * fVar357) * fVar314;
  if (auVar175._0_4_ < fVar317) goto LAB_0038c7fe;
  fVar435 = (ray->super_RayK<1>).tfar;
  auVar431 = ZEXT416((uint)fVar435);
  if (fVar435 < auVar175._0_4_) goto LAB_0038c7fe;
  fVar307 = 1.0 - fVar357;
  fVar317 = 1.0 - fVar357;
  fVar340 = 1.0 - fVar357;
  fVar348 = 1.0 - fVar357;
  fVar258 = local_3a8 * fVar307 + local_378 * fVar357;
  fVar305 = fStack_3a4 * fVar317 + fStack_374 * fVar357;
  fVar192 = fStack_3a0 * fVar340 + fStack_370 * fVar357;
  fVar259 = fStack_39c * fVar348 + fStack_36c * fVar357;
  fVar369 = local_3c8 * fVar307 + local_3dc.m128[1] * fVar357;
  fVar381 = fStack_3c4 * fVar317 + local_3dc.m128[2] * fVar357;
  fVar413 = fStack_3c0 * fVar340 + local_3dc.m128[3] * fVar357;
  fVar428 = fStack_3bc * fVar348 + fStack_3cc * fVar357;
  fVar370 = fVar369 - fVar258;
  fVar397 = fVar381 - fVar305;
  fVar417 = fVar413 - fVar192;
  fVar433 = fVar428 - fVar259;
  auVar203._4_4_ = fVar384;
  auVar203._0_4_ = fVar384;
  auVar203._8_4_ = fVar384;
  auVar203._12_4_ = fVar384;
  fVar258 = (((fVar258 - (local_398 * fVar307 + local_388 * fVar357)) * fVar339 + fVar384 * fVar370)
             * fVar339 +
            (fVar370 * fVar339 + ((fVar307 * local_3b8 + fVar357 * local_218) - fVar369) * fVar384)
            * fVar384) * 3.0;
  fVar305 = (((fVar305 - (fStack_394 * fVar317 + fStack_384 * fVar357)) * fVar339 +
             fVar384 * fVar397) * fVar339 +
            (fVar397 * fVar339 + ((fVar317 * fStack_3b4 + fVar357 * fStack_214) - fVar381) * fVar384
            ) * fVar384) * 3.0;
  fVar192 = (((fVar192 - (fStack_390 * fVar340 + fStack_380 * fVar357)) * fVar339 +
             fVar384 * fVar417) * fVar339 +
            (fVar417 * fVar339 + ((fVar340 * fStack_3b0 + fVar357 * fStack_210) - fVar413) * fVar384
            ) * fVar384) * 3.0;
  fVar259 = (((fVar259 - (fStack_38c * fVar348 + fStack_37c * fVar357)) * fVar339 +
             fVar384 * fVar433) * fVar339 +
            (fVar433 * fVar339 + ((fVar348 * fStack_3ac + fVar357 * fStack_20c) - fVar428) * fVar384
            ) * fVar384) * 3.0;
  pGVar21 = (context->scene->geometries).items[uVar138].ptr;
  uVar139 = (ray->super_RayK<1>).mask;
  paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar139;
  if ((pGVar21->mask & uVar139) == 0) goto LAB_0038c7fe;
  fVar307 = fVar260 * local_188 + fVar310 * local_198 + fVar311 * local_1a8 + fVar314 * local_1b8;
  fVar317 = fVar260 * fStack_184 +
            fVar310 * fStack_194 + fVar311 * fStack_1a4 + fVar314 * fStack_1b4;
  fVar339 = fVar260 * fStack_180 +
            fVar310 * fStack_190 + fVar311 * fStack_1a0 + fVar314 * fStack_1b0;
  fVar260 = fVar260 * fStack_17c +
            fVar310 * fStack_18c + fVar311 * fStack_19c + fVar314 * fStack_1ac;
  auVar203._0_4_ = fVar317 * fVar258 - fVar305 * fVar307;
  auVar203._4_4_ = fVar339 * fVar305 - fVar192 * fVar317;
  auVar203._8_4_ = fVar307 * fVar192 - fVar258 * fVar339;
  auVar203._12_4_ = fVar260 * fVar259 - fVar259 * fVar260;
  uVar245 = CONCAT44(auVar203._8_4_,auVar203._4_4_);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = auVar175._0_4_;
    *(undefined8 *)&(ray->Ng).field_0 = uVar245;
    (ray->Ng).field_0.field_0.z = auVar203._0_4_;
    ray->u = fVar384;
    ray->v = fVar357;
    ray->primID = (uint)local_340;
    ray->geomID = uVar138;
    ray->instID[0] = context->user->instID[0];
    uVar139 = context->user->instPrimID[0];
    ray->instPrimID[0] = uVar139;
    paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar139;
    goto LAB_0038c7fe;
  }
  local_1f8 = uVar245;
  local_1f0 = auVar203._0_4_;
  local_1ec = fVar384;
  fStack_1e8 = fVar357;
  local_1e4 = (uint)local_340;
  local_1e0 = uVar138;
  local_1dc = context->user->instID[0];
  local_1d8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = auVar175._0_4_;
  local_3dc.m128[0] = -NAN;
  local_288.valid = (int *)&local_3dc;
  local_288.geometryUserPtr = pGVar21->userPtr;
  local_288.context = context->user;
  local_288.ray = (RTCRayN *)ray;
  local_288.hit = (RTCHitN *)&local_1f8;
  local_288.N = 1;
  if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar21->intersectionFilterN)(&local_288);
    auVar203._8_8_ = extraout_XMM1_Qb;
    auVar203._0_8_ = extraout_XMM1_Qa;
    if (*(float *)local_288.valid == 0.0) goto LAB_0038d890;
  }
  p_Var26 = context->args->filter;
  if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var26)(&local_288);
    auVar203._8_8_ = extraout_XMM1_Qb_00;
    auVar203._0_8_ = extraout_XMM1_Qa_00;
    if (*(float *)local_288.valid == 0.0) {
LAB_0038d890:
      auVar175 = ZEXT416((uint)fVar435);
      (ray->super_RayK<1>).tfar = fVar435;
      paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.valid;
      goto LAB_0038c7fe;
    }
  }
  *(float *)((long)local_288.ray + 0x30) = *(float *)local_288.hit;
  *(float *)((long)local_288.ray + 0x34) = *(float *)(local_288.hit + 4);
  *(float *)((long)local_288.ray + 0x38) = *(float *)(local_288.hit + 8);
  *(float *)((long)local_288.ray + 0x3c) = *(float *)(local_288.hit + 0xc);
  auVar175 = ZEXT416((uint)*(float *)(local_288.hit + 0x10));
  *(float *)((long)local_288.ray + 0x40) = *(float *)(local_288.hit + 0x10);
  *(float *)((long)local_288.ray + 0x44) = *(float *)(local_288.hit + 0x14);
  *(float *)((long)local_288.ray + 0x48) = *(float *)(local_288.hit + 0x18);
  *(float *)((long)local_288.ray + 0x4c) = *(float *)(local_288.hit + 0x1c);
  *(float *)((long)local_288.ray + 0x50) = *(float *)(local_288.hit + 0x20);
  paVar132 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.ray;
  goto LAB_0038c7fe;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }